

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodePreconditioner.cpp
# Opt level: O3

int pele::physics::reactions::cvode::Precond_custom
              (Real param_1,N_Vector u,N_Vector param_3,int jok,int *jcurPtr,Real gamma,
              void *user_data)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  double *pdVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int i_2;
  int iVar19;
  int iVar20;
  realtype *prVar21;
  double *pdVar22;
  double *pdVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  double *pdVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  Real h_RT [9];
  Real c_R [9];
  Real dcRdT [9];
  Real activity [9];
  Real massfrac [9];
  undefined8 uStack_5d0;
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  double local_5a8;
  undefined1 auStack_5a0 [16];
  double dStack_590;
  undefined1 *local_588;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  double local_4f8 [10];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  double local_478;
  double dStack_470;
  double local_468;
  double local_460;
  double local_458;
  double local_450;
  undefined1 local_448 [16];
  double local_438;
  double local_430;
  double local_428;
  double local_418;
  undefined8 uStack_410;
  double local_408;
  undefined8 uStack_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  double local_3b8;
  undefined8 uStack_3b0;
  double local_3a8;
  undefined8 uStack_3a0;
  double local_398;
  double dStack_390;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  double local_358 [2];
  undefined1 local_348 [16];
  double local_338;
  undefined1 auStack_330 [16];
  undefined1 auStack_320 [24];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  double local_2e8;
  undefined8 uStack_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  double local_2b8;
  undefined8 uStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  realtype *local_290;
  undefined1 local_288 [16];
  double local_278;
  double local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  double local_248;
  double local_238 [10];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined8 *local_1c0;
  realtype *local_1b8;
  int *local_1b0;
  long *local_1a8;
  long local_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  double dStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  double local_148;
  double dStack_140;
  double local_138;
  double local_128;
  undefined8 uStack_120;
  double local_118 [10];
  double local_c8 [10];
  double local_78 [9];
  
  local_1e8._8_4_ = in_XMM1_Dc;
  local_1e8._0_8_ = gamma;
  local_1e8._12_4_ = in_XMM1_Dd;
  prVar21 = N_VGetArrayPointer(u);
  uVar2 = *(uint *)((long)user_data + 8);
  iVar20 = *(int *)((long)user_data + 0x14);
  lVar4 = *(long *)((long)user_data + 0xa0);
  local_1c0 = *(undefined8 **)((long)user_data + 0x80);
  local_1a8 = *(long **)((long)user_data + 0x90);
  local_1a0 = *(long *)((long)user_data + 0x68);
  local_118[0] = 2.016;
  local_118[1] = 31.998;
  local_118[2] = 18.015;
  local_118[3] = 1.008;
  local_118[4] = 15.999;
  local_118[5] = 17.007;
  local_118[6] = 33.006;
  local_118[7] = 34.014;
  local_118[8] = 28.014;
  iVar19 = 0;
  if ((jok == 0) && (iVar19 = 1, 0 < (int)uVar2)) {
    uVar30 = 0;
    uVar31 = 0;
    uVar32 = 0;
    local_1b0 = jcurPtr;
    local_1b8 = prVar21;
    local_290 = prVar21;
    do {
      lVar25 = 0;
      dVar36 = 0.0;
      do {
        dVar36 = dVar36 + local_290[lVar25];
        lVar25 = lVar25 + 1;
      } while (lVar25 != 9);
      local_78[6] = 0.0;
      local_78[7] = 0.0;
      local_78[4] = 0.0;
      local_78[5] = 0.0;
      local_78[2] = 0.0;
      local_78[3] = 0.0;
      local_78[0] = 0.0;
      local_78[1] = 0.0;
      local_78[8] = 0.0;
      lVar25 = 0;
      do {
        local_78[lVar25] = local_290[lVar25] * (1.0 / dVar36);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 9);
      local_2e8 = prVar21[uVar30 * 10 + 9];
      local_c8[6] = 0.0;
      local_c8[7] = 0.0;
      local_c8[4] = 0.0;
      local_c8[5] = 0.0;
      local_c8[2] = 0.0;
      local_c8[3] = 0.0;
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[8] = 0.0;
      local_5c8._8_8_ = 0x3fa000418a43bf8c;
      local_5c8._0_8_ = 0x3fdfbefbefbefbf0;
      local_5b8._8_8_ = 0x3fefbefbefbefbf0;
      local_5b8._0_8_ = 0x3fac6bb6f569cbd9;
      local_5a8 = 0.06250390649415588;
      auStack_5a0._8_8_ = 0x3f9f065042c3dbd3;
      auStack_5a0._0_8_ = 0x3fae1af1b70e12fe;
      dStack_590 = 0.029399658963956014;
      local_588 = &DAT_3fa246cdaf410bdd;
      lVar25 = 0;
      do {
        local_c8[lVar25] = local_78[lVar25] * dVar36 * *(double *)(local_5c8 + lVar25 * 8);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 9);
      if (ABS(local_2e8 - (double)CONCAT44(uVar32,uVar31)) <= 1.0) {
        lVar25 = *(long *)(lVar4 + -8 + uVar30 * 8);
        lVar29 = *(long *)(lVar4 + uVar30 * 8);
        lVar26 = 0;
        do {
          lVar28 = 0;
          do {
            *(undefined8 *)(lVar29 + lVar28) = *(undefined8 *)(lVar25 + lVar28);
            lVar28 = lVar28 + 0x50;
          } while (lVar28 != 800);
          lVar26 = lVar26 + 1;
          lVar29 = lVar29 + 8;
          lVar25 = lVar25 + 8;
        } while (lVar26 != 10);
      }
      else {
        uStack_2e0 = 0;
        pdVar5 = *(double **)(lVar4 + uVar30 * 8);
        lVar25 = 0;
        do {
          local_4f8[lVar25] = local_c8[lVar25] * 1000000.0;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 9);
        memset(pdVar5,0,800);
        dStack_590 = 0.0;
        local_5a8 = 0.0;
        auStack_5a0 = ZEXT816(0);
        local_5b8 = ZEXT816(0);
        local_5c8 = ZEXT816(0);
        local_588 = (undefined1 *)0x0;
        dVar36 = log(local_2e8);
        local_128 = local_2e8 * local_2e8;
        local_188 = local_2e8 * local_128;
        dVar38 = 1.0 / local_2e8;
        local_3e8._0_8_ = 12186.6002121605 / local_2e8;
        dVar39 = 0.0;
        lVar25 = 0;
        uStack_180 = uStack_2e0;
        uStack_120 = uStack_2e0;
        do {
          dVar39 = dVar39 + local_4f8[lVar25];
          lVar25 = lVar25 + 1;
        } while (lVar25 != 9);
        local_198 = local_2e8 * local_188;
        local_408 = dVar38 * dVar38;
        uStack_400 = 0;
        uStack_190 = uStack_2e0;
        if (1000.0 <= local_2e8) {
          local_478 = local_198 * 5.68217655e-17 +
                      local_188 * -1.479401233333333e-12 +
                      local_128 * 2.098069983333333e-08 +
                      local_2e8 * -0.0003067598445 +
                      dVar36 * -3.69757819 + dVar38 * -1233.93018 + 0.5084126000000002;
          local_458 = local_198 * -1.27832357e-15 +
                      local_188 * 3.00249098e-11 +
                      local_128 * -2.9100867e-07 + local_2e8 * 0.00152814644 + 2.67214561 +
                      dVar38 * -29899.209;
          local_2b8 = local_198 * 3.195808935e-16 +
                      local_188 * -1.000830325e-11 +
                      local_128 * 1.455043351666667e-07 +
                      local_2e8 * -0.001528146445 +
                      dVar36 * -2.67214561 + dVar38 * -29899.209 + -4.190671200000001;
          local_418 = local_198 * -0.0 +
                      local_188 * -0.0 +
                      local_128 * -0.0 +
                      local_2e8 * -0.0 + dVar36 * -2.5 + dVar38 * 25471.627 + 2.960117638;
          local_3b8 = local_198 * 2.18402575e-17 +
                      local_188 * -3.792556183333333e-13 +
                      local_128 * 5.171338916666667e-10 +
                      local_2e8 * 1.377530955e-05 +
                      dVar36 * -2.54205966 + dVar38 * 29230.8027 + -2.37824845;
          local_468 = dVar38 * -835.033997 +
                      local_198 * 3.16550358e-16 +
                      local_188 * -2.30789455e-12 +
                      local_128 * -1.8779429e-08 + local_2e8 * 0.000350032206 + 2.99142337;
          dVar34 = dVar38 * 3683.62875 +
                   local_198 * -2.66391752e-16 +
                   local_188 * 7.63046685e-12 +
                   local_128 * -8.63609193e-08 + local_2e8 * 0.00052825224 + 2.86472886;
          local_448._8_4_ = SUB84(dVar34,0);
          local_448._0_8_ =
               dVar38 * 29230.8027 +
               local_198 * -8.736103e-17 +
               local_188 * 1.13776685e-12 +
               local_128 * -1.03426778e-09 + local_2e8 * -1.37753096e-05 + 2.54205966;
          local_448._12_4_ = (int)((ulong)dVar34 >> 0x20);
          local_430 = dVar38 * -18006.9609 +
                      local_198 * -2.86330712e-15 +
                      local_188 * 5.87225893e-11 +
                      local_128 * -4.9156294e-07 + local_2e8 * 0.0021680682 + 4.57316685;
          local_428 = local_198 * -1.3506702e-15 +
                      local_188 * 2.52426e-11 +
                      local_128 * -1.89492033e-07 + local_2e8 * 0.0007439885 + 2.92664;
          local_438 = local_198 * -2.1581707e-15 +
                      local_188 * 2.85615925e-11 +
                      local_128 * -2.11219383e-07 + local_2e8 * 0.00111991006 + 4.0172109;
          dVar33 = dVar38 * 25471.627 +
                   local_198 * 0.0 + local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 2.5;
          dVar35 = dVar38 * -1233.93018 +
                   local_198 * -2.27287062e-16 +
                   local_188 * 4.4382037e-12 +
                   local_128 * -4.19613997e-08 + local_2e8 * 0.000306759845 + 3.69757819;
          dVar34 = local_198 * 6.6597938e-17 +
                   local_188 * -2.54348895e-12 +
                   local_128 * 4.318045966666667e-08 +
                   local_2e8 * -0.00052825224 +
                   dVar36 * -2.86472886 + dVar38 * 3683.62875 + -2.83691187;
          local_388._8_4_ = SUB84(dVar34,0);
          local_388._0_8_ =
               local_198 * 5.39542675e-16 +
               local_188 * -9.520530833333334e-12 +
               local_128 * 1.056096916666667e-07 +
               local_2e8 * -0.001119910065 +
               dVar36 * -4.0172109 + dVar38 * 111.856713 + 0.2321087500000001;
          local_388._12_4_ = (int)((ulong)dVar34 >> 0x20);
          local_398 = local_198 * -7.91375895e-17 +
                      local_188 * 7.692981816666667e-13 +
                      local_128 * 9.389714483333333e-09 +
                      local_2e8 * -0.0003500322055 +
                      dVar36 * -2.99142337 + dVar38 * -835.033997 + 4.34653354;
          dStack_390 = local_198 * 7.1582678e-16 +
                       local_188 * -1.957419641666667e-11 +
                       local_128 * 2.4578147e-07 +
                       local_2e8 * -0.002168068195 +
                       dVar36 * -4.57316685 + dVar38 * -18006.9609 + 4.072029891;
          dVar34 = -922.7977;
          dVar37 = 111.856713;
        }
        else {
          local_478 = local_198 * 4.38427696e-14 +
                      local_188 * -1.094897691666667e-10 +
                      local_128 * 9.593584116666666e-08 +
                      local_2e8 * -0.000563743175 +
                      dVar36 * -3.2129364 + dVar38 * -1005.24902 + -2.82180119;
          local_458 = local_198 * -5.01317694e-13 +
                      local_188 * 1.74214532e-09 +
                      local_128 * -2.11823211e-06 + local_2e8 * 0.00173749123 + 3.38684249 +
                      dVar38 * -30208.1133;
          local_2b8 = local_198 * 1.253294235e-13 +
                      local_188 * -5.807151058333333e-10 +
                      local_128 * 1.059116055e-06 +
                      local_2e8 * -0.00173749123 +
                      dVar36 * -3.38684249 + dVar38 * -30208.1133 + 0.7966096399999998;
          local_418 = local_198 * -0.0 +
                      local_188 * -0.0 +
                      local_128 * -0.0 +
                      local_2e8 * -0.0 + dVar36 * -2.5 + dVar38 * 25471.627 + 2.960117608;
          local_3b8 = local_198 * -1.94534818e-14 +
                      local_188 * 1.335702658333333e-10 +
                      local_128 * -4.035052833333333e-07 +
                      local_2e8 * 0.000819083245 +
                      dVar36 * -2.94642878 + dVar38 * 29147.6445 + -0.01756619999999964;
          local_468 = dVar38 * -1012.52087 +
                      local_198 * 8.26974448e-14 +
                      local_188 * -2.36885858e-11 +
                      local_128 * -2.71433843e-07 + local_2e8 * 0.000412472087 + 3.29812431;
          dVar34 = dVar38 * 3346.30913 +
                   local_198 * 4.12474758e-13 +
                   local_188 * -1.44963411e-09 +
                   local_128 * 2.1758823e-06 + local_2e8 * -0.0016127247 + 4.12530561;
          local_448._8_4_ = SUB84(dVar34,0);
          local_448._0_8_ =
               dVar38 * 29147.6445 +
               local_198 * 7.78139272e-14 +
               local_188 * -4.00710797e-10 +
               local_128 * 8.07010567e-07 + local_2e8 * -0.000819083245 + 2.94642878;
          local_448._12_4_ = (int)((ulong)dVar34 >> 0x20);
          local_430 = dVar38 * -17663.1465 +
                      local_198 * 4.9430295e-13 +
                      local_188 * -1.15645138e-09 +
                      local_128 * -4.95004193e-08 + local_2e8 * 0.0032846129 + 3.38875365;
          local_428 = local_198 * -4.88971e-13 +
                      local_188 * 1.41037875e-09 +
                      local_128 * -1.321074e-06 + local_2e8 * 0.00070412 + 3.298677;
          local_438 = local_198 * 1.85845025e-12 +
                      local_188 * -6.06909735e-09 +
                      local_128 * 7.05276303e-06 + local_2e8 * -0.00237456025 + 4.30179801;
          dVar33 = dVar38 * 25471.627 +
                   local_198 * 0.0 + local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 2.5;
          dVar35 = dVar38 * -1005.24902 +
                   local_198 * -1.75371078e-13 +
                   local_188 * 3.28469308e-10 +
                   local_128 * -1.91871682e-07 + local_2e8 * 0.000563743175 + 3.2129364;
          dVar34 = local_198 * -1.031186895e-13 +
                   local_188 * 4.832113691666666e-10 +
                   local_128 * -1.087941151666667e-06 +
                   local_2e8 * 0.001612724695 +
                   dVar36 * -4.12530561 + dVar38 * 3346.30913 + 4.81573857;
          local_388._8_4_ = SUB84(dVar34,0);
          local_388._0_8_ =
               local_198 * -4.646125620000001e-13 +
               local_188 * 2.02303245e-09 +
               local_128 * -3.526381516666666e-06 +
               local_2e8 * 0.002374560255 +
               dVar36 * -4.30179801 + dVar38 * 294.80804 + 0.5851355599999999;
          local_388._12_4_ = (int)((ulong)dVar34 >> 0x20);
          local_398 = local_198 * -2.06743612e-14 +
                      local_188 * 7.896195275e-12 +
                      local_128 * 1.357169215e-07 +
                      local_2e8 * -0.000412472087 +
                      dVar36 * -3.29812431 + dVar38 * -1012.52087 + 6.5922184;
          dStack_390 = local_198 * -1.235757375e-13 +
                       local_188 * 3.854837933333333e-10 +
                       local_128 * 2.475020966666667e-08 +
                       local_2e8 * -0.003284612905 +
                       dVar36 * -3.38875365 + dVar38 * -17663.1465 + -3.39660955;
          dVar34 = -1020.9;
          dVar37 = 294.80804;
        }
        dStack_470 = (double)uStack_2e0;
        local_428 = dVar38 * dVar34 + local_428;
        local_438 = dVar38 * dVar37 + local_438;
        local_568._8_4_ = SUB84(local_438,0);
        local_568._0_8_ = local_428;
        local_568._12_4_ = (int)((ulong)local_438 >> 0x20);
        local_2f8._0_8_ = dVar39;
        local_3d8._0_8_ = local_4f8[3];
        local_2d8 = dVar38 * -0.0;
        uStack_2d0 = 0;
        local_460 = dVar35;
        local_450 = dVar33;
        uStack_410 = dStack_470;
        uStack_3b0 = dStack_470;
        uStack_2b0 = dStack_470;
        local_548._0_8_ =
             local_4f8[2] * 10.0 + local_4f8[1] * -0.21999999999999997 + local_4f8[0] + dVar39;
        local_508._0_8_ = local_4f8[1] * local_4f8[3];
        local_578._0_8_ = 1.0 / (12186.6002121605 / local_2e8);
        dVar39 = exp(dVar36 * 0.6 + local_2d8);
        local_368._0_8_ = dVar39 * 1475000.0;
        local_2c8._8_4_ = (int)uStack_400;
        local_2c8._0_8_ = local_408 * 0.0;
        local_2c8._12_4_ = (int)((ulong)uStack_400 >> 0x20);
        local_378._8_8_ = 0;
        local_378._0_8_ = dVar38 * 0.6 + local_408 * 0.0;
        dVar39 = exp(dVar36 * -1.72 + dVar38 * -264.08810621431707);
        dVar39 = dVar39 * 6.366e+20 * (((double)local_548._0_8_ * 1e-12) / (double)local_368._0_8_);
        local_528._0_8_ =
             ((dVar38 * -1.72 + local_408 * 264.08810621431707) - (double)local_378._0_8_) *
             0.43429448190325176;
        local_528._8_8_ = 0;
        local_498._8_8_ = 0;
        local_498._0_8_ = (double)local_528._0_8_ / (dVar39 + 1.0);
        local_518._0_8_ = dVar39 / (dVar39 + 1.0);
        dVar39 = log10(dVar39);
        local_488._8_4_ = (int)uStack_2e0;
        local_488._0_8_ = local_2e8 / -1e-30;
        local_488._12_4_ = (int)((ulong)uStack_2e0 >> 0x20);
        local_538._0_8_ = dVar39;
        dVar39 = exp(local_2e8 / -1e-30);
        local_558._8_4_ = (int)uStack_2e0;
        local_558._0_8_ = local_2e8 / -1e+30;
        local_558._12_4_ = (int)((ulong)uStack_2e0 >> 0x20);
        local_3c8._0_8_ = dVar39 * 0.19999999999999996;
        local_3a8 = exp(local_2e8 / -1e+30);
        local_3a8 = local_3a8 * 0.8;
        dVar39 = (double)local_3c8._0_8_ + local_3a8 + 0.0;
        local_3f8._0_8_ = dVar39;
        local_548._0_8_ = log10(dVar39);
        dVar39 = (double)local_548._0_8_ * -1.27 + 0.75;
        local_4a8._8_4_ = extraout_XMM0_Dc_00;
        local_4a8._0_8_ = dVar39;
        local_4a8._12_4_ = extraout_XMM0_Dd_00;
        local_2a8 = (double)local_548._0_8_ * -0.67 + -0.4 + (double)local_538._0_8_;
        dVar34 = 1.0 / (local_2a8 * -0.14 + dVar39);
        local_2a8 = local_2a8 * dVar34;
        dVar39 = 1.0 / (local_2a8 * local_2a8 + 1.0);
        local_1d8._0_8_ = dVar39;
        local_308._0_8_ = dVar34;
        local_538._0_8_ = pow(10.0,(double)local_548._0_8_ * dVar39);
        dVar39 = ((double)local_548._0_8_ + (double)local_548._0_8_) * (double)local_1d8._0_8_ *
                 (double)local_1d8._0_8_ * local_2a8 * (double)local_308._0_8_;
        dVar34 = -(double)local_4a8._0_8_ * dVar39 * (double)local_308._0_8_;
        local_548._0_8_ =
             (dVar39 * local_2a8 * -1.27 + dVar34 * -0.67 + (double)local_1d8._0_8_) *
             (local_3a8 / -1e+30 + (double)local_3c8._0_8_ / -1e-30) *
             (0.43429448190325176 / (double)local_3f8._0_8_) + (double)local_528._0_8_ * dVar34 +
             (double)local_498._0_8_;
        local_3c8._0_8_ = local_4f8[6];
        local_498._8_4_ = SUB84(dStack_470,0);
        local_498._0_8_ = local_478 + local_418;
        local_498._12_4_ = (int)((ulong)dStack_470 >> 0x20);
        dVar39 = exp((local_478 + local_418) - (double)local_388._0_8_);
        dVar39 = (double)local_368._0_8_ / (dVar39 * (double)local_578._0_8_);
        dVar37 = (double)local_538._0_8_ * (double)local_518._0_8_;
        dVar34 = ((double)local_368._0_8_ * (double)local_508._0_8_ -
                 (double)local_3c8._0_8_ * dVar39) * dVar37;
        local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar34;
        local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar34;
        auStack_5a0._8_8_ = dVar34 + (double)auStack_5a0._8_8_;
        local_358[0] = 0.0;
        local_358[1] = (double)local_3d8._0_8_ * (double)local_368._0_8_ * dVar37 + 0.0;
        local_348._0_8_ = 0;
        local_348._8_8_ = (double)local_368._0_8_ * dVar37 * local_4f8[1] + 0.0;
        local_338 = 0.0;
        auStack_330._0_8_ = 0;
        auStack_330._8_8_ = 0.0 - dVar39 * dVar37;
        auStack_320._0_16_ = ZEXT816(0);
        pdVar23 = pdVar5 + 1;
        lVar25 = 0;
        pdVar22 = pdVar23;
        do {
          dVar1 = local_358[lVar25];
          *pdVar22 = *pdVar22 - dVar1;
          pdVar22[2] = pdVar22[2] - dVar1;
          pdVar22[5] = dVar1 + pdVar22[5];
          lVar25 = lVar25 + 1;
          pdVar22 = pdVar22 + 10;
        } while (lVar25 != 9);
        dVar39 = dVar37 * ((double)local_378._0_8_ * (double)local_368._0_8_ *
                           (double)local_508._0_8_ +
                          -((double)local_378._0_8_ -
                           (((double)local_568._8_8_ - (dVar35 + dVar33)) + 1.0) * dVar38) * dVar39
                          * (double)local_3c8._0_8_) +
                 (double)local_548._0_8_ * 2.302585092994046 * dVar34;
        pdVar5[0x5b] = pdVar5[0x5b] - dVar39;
        pdVar5[0x5d] = pdVar5[0x5d] - dVar39;
        pdVar5[0x60] = dVar39 + pdVar5[0x60];
        local_548._0_8_ = local_4f8[2] * 11.0 + local_4f8[0] * 1.5 + (double)local_2f8._0_8_;
        local_568._0_8_ = local_4f8[7];
        local_378._8_4_ = extraout_XMM0_Dc;
        local_378._0_8_ = dVar36 * 0.0;
        local_378._12_4_ = extraout_XMM0_Dd;
        dVar39 = exp(dVar38 * -24370.78312492259 + dVar36 * 0.0);
        dVar39 = dVar39 * 295100000000000.0;
        local_368._8_8_ = 0;
        local_368._0_8_ = dVar38 * 0.0;
        local_3d8._8_4_ = (int)uStack_400;
        local_3d8._0_8_ = local_408 * 24370.78312492259 + dVar38 * 0.0;
        local_3d8._12_4_ = (int)((ulong)uStack_400 >> 0x20);
        dVar34 = exp(dVar38 * -22896.35829411476 + (double)local_378._0_8_);
        dVar34 = dVar34 * 1.202e+17 * (((double)local_548._0_8_ * 1e-06) / dVar39);
        local_508._0_8_ = dVar34 / (dVar34 + 1.0);
        local_518._0_8_ =
             ((local_408 * 22896.35829411476 + (double)local_368._0_8_) - (double)local_3d8._0_8_) *
             0.43429448190325176;
        local_518._8_8_ = uStack_400;
        local_3c8._8_8_ = uStack_400;
        local_3c8._0_8_ = (double)local_518._0_8_ / (dVar34 + 1.0);
        dVar34 = log10(dVar34);
        local_4a8._0_8_ = dVar34;
        dVar34 = exp((double)local_488._0_8_);
        local_548._0_8_ = dVar34 * 0.5;
        dVar34 = exp((double)local_558._0_8_);
        local_3a8 = (double)local_548._0_8_ + dVar34 * 0.5 + 0.0;
        local_528._0_8_ = dVar34 * 0.5;
        dVar34 = log10(local_3a8);
        dVar37 = dVar34 * -1.27 + 0.75;
        local_538._8_4_ = extraout_XMM0_Dc_01;
        local_538._0_8_ = dVar37;
        local_538._12_4_ = extraout_XMM0_Dd_01;
        local_3f8._0_8_ = dVar34 * -0.67 + -0.4 + (double)local_4a8._0_8_;
        local_4a8._0_8_ = 1.0 / ((double)local_3f8._0_8_ * -0.14 + dVar37);
        local_3f8._0_8_ = (double)local_3f8._0_8_ * (double)local_4a8._0_8_;
        local_308._0_8_ = 1.0 / ((double)local_3f8._0_8_ * (double)local_3f8._0_8_ + 1.0);
        local_488._0_8_ = dVar34;
        dVar34 = pow(10.0,dVar34 * (double)local_308._0_8_);
        dVar37 = ((double)local_488._0_8_ + (double)local_488._0_8_) * (double)local_308._0_8_ *
                 (double)local_308._0_8_ * (double)local_3f8._0_8_ * (double)local_4a8._0_8_;
        dVar33 = -(double)local_538._0_8_ * dVar37 * (double)local_4a8._0_8_;
        local_488._0_8_ =
             (dVar37 * (double)local_3f8._0_8_ * -1.27 + dVar33 * -0.67 + (double)local_308._0_8_) *
             ((double)local_528._0_8_ / -1e+30 + (double)local_548._0_8_ / -1e-30) *
             (0.43429448190325176 / local_3a8) + (double)local_518._0_8_ * dVar33 +
             (double)local_3c8._0_8_;
        local_518._0_8_ = local_4f8[5];
        dVar37 = local_388._8_8_;
        local_548._8_4_ = local_388._8_4_;
        local_548._0_8_ = dVar37;
        local_548._12_4_ = local_388._12_4_;
        local_3c8._8_4_ = SUB84(dStack_390,0);
        local_3c8._0_8_ = dStack_390;
        local_3c8._12_4_ = (int)((ulong)dStack_390 >> 0x20);
        local_528._0_8_ = local_4f8[5] * local_4f8[5];
        local_558._0_8_ = dVar34;
        dVar34 = exp(dStack_390 - (dVar37 + dVar37));
        dVar37 = local_4f8[0];
        dVar34 = dVar39 / (dVar34 * (double)local_3e8._0_8_);
        dVar35 = (double)local_558._0_8_ * (double)local_508._0_8_;
        dVar33 = (dVar39 * (double)local_568._0_8_ - (double)local_528._0_8_ * dVar34) * dVar35;
        auStack_5a0._0_8_ = dVar33 + dVar33 + (double)auStack_5a0._0_8_;
        dStack_590 = dStack_590 - dVar33;
        local_358[0] = 0.0;
        local_358[1] = 0.0;
        local_348 = ZEXT816(0);
        local_338 = 0.0;
        auStack_330._8_8_ = 0;
        auStack_330._0_8_ = dVar34 * dVar35 * -2.0 * (double)local_518._0_8_ + 0.0;
        auStack_320._8_8_ = 0;
        auStack_320._0_8_ = dVar39 * dVar35 + 0.0;
        pdVar22 = pdVar5 + 7;
        lVar25 = 0;
        do {
          dVar1 = local_358[lVar25];
          pdVar22[-2] = dVar1 + dVar1 + pdVar22[-2];
          *pdVar22 = *pdVar22 - dVar1;
          lVar25 = lVar25 + 1;
          pdVar22 = pdVar22 + 10;
        } while (lVar25 != 9);
        dVar39 = dVar35 * ((double)local_3d8._0_8_ * dVar39 * (double)local_568._0_8_ +
                          -((double)local_3d8._0_8_ -
                           ((((double)local_448._8_8_ + (double)local_448._8_8_) - local_430) + -1.0
                           ) * dVar38) * dVar34 * (double)local_528._0_8_) +
                 (double)local_488._0_8_ * 2.302585092994046 * dVar33;
        pdVar5[0x5f] = dVar39 + dVar39 + pdVar5[0x5f];
        pdVar5[0x61] = pdVar5[0x61] - dVar39;
        local_3d8._0_8_ = local_4f8[2] * 11.0 + local_4f8[0] * 1.5 + (double)local_2f8._0_8_;
        local_568._0_8_ = exp(dVar36 * -1.4 + dVar38 * -52525.755576696676);
        local_568._0_8_ = (double)local_568._0_8_ * 45770000000000.0;
        local_508._8_8_ = 0;
        local_508._0_8_ = dVar38 * -1.4 + local_408 * 52525.755576696676;
        local_488._0_8_ = local_4f8[3];
        local_558._0_8_ = local_4f8[3] * local_4f8[3];
        dVar39 = exp(local_398 - (local_418 + local_418));
        dVar39 = (double)local_568._0_8_ / ((double)local_3e8._0_8_ * dVar39);
        local_358[1] = (double)local_568._0_8_ * dVar37 - (double)local_558._0_8_ * dVar39;
        dVar34 = (double)local_3d8._0_8_ * local_358[1];
        local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar34;
        local_5b8._8_8_ = dVar34 + dVar34 + (double)local_5b8._8_8_;
        local_358[0] = local_358[1] * 2.5 + (double)local_568._0_8_ * (double)local_3d8._0_8_;
        local_348._0_8_ = local_358[1] * 12.0;
        local_348._8_8_ =
             dVar39 * (double)local_3d8._0_8_ * -2.0 * (double)local_488._0_8_ + local_358[1];
        local_338 = local_358[1];
        uVar31 = (undefined4)((ulong)local_358[1] >> 0x20);
        auStack_320._8_4_ = SUB84(local_358[1],0);
        auStack_320._0_8_ = local_358[1];
        auStack_320._12_4_ = uVar31;
        auStack_330._8_4_ = SUB84(local_358[1],0);
        auStack_330._0_8_ = local_358[1];
        auStack_330._12_4_ = uVar31;
        lVar25 = 0;
        pdVar22 = pdVar5;
        do {
          dVar34 = local_358[lVar25];
          *pdVar22 = *pdVar22 - dVar34;
          pdVar22[3] = dVar34 + dVar34 + pdVar22[3];
          lVar25 = lVar25 + 1;
          pdVar22 = pdVar22 + 10;
        } while (lVar25 != 9);
        local_3d8._0_8_ =
             (double)local_3d8._0_8_ *
             ((double)local_508._0_8_ * (double)local_568._0_8_ * dVar37 -
             ((double)local_508._0_8_ - (((local_450 + local_450) - local_468) + -1.0) * dVar38) *
             dVar39 * (double)local_558._0_8_);
        pdVar5[0x5a] = pdVar5[0x5a] - (double)local_3d8._0_8_;
        pdVar5[0x5d] = (double)local_3d8._0_8_ + (double)local_3d8._0_8_ + pdVar5[0x5d];
        dVar34 = local_4f8[2] * 11.0 + local_4f8[0] * 1.5 + (double)local_2f8._0_8_;
        local_3e8._0_8_ = local_4f8[4];
        local_3d8._0_8_ = local_4f8[4] * local_4f8[4];
        dVar39 = exp(dVar36 * -0.5 + local_2d8);
        local_568._0_8_ = dVar39 * 6165.0;
        local_508._8_8_ = 0;
        local_508._0_8_ = dVar38 * -0.5 + (double)local_2c8._0_8_;
        local_558._0_8_ = local_4f8[1];
        local_488._8_4_ = SUB84(dStack_470,0);
        local_488._0_8_ = -local_478;
        local_488._12_4_ = (uint)((ulong)dStack_470 >> 0x20) ^ 0x80000000;
        dVar39 = exp((local_3b8 + local_3b8) - local_478);
        dVar39 = (double)local_568._0_8_ / (dVar39 * (double)local_578._0_8_);
        local_348._8_8_ =
             (double)local_568._0_8_ * (double)local_3d8._0_8_ - (double)local_558._0_8_ * dVar39;
        dVar37 = dVar34 * (double)local_348._8_8_;
        local_5c8._8_8_ = (double)local_5c8._8_8_ + dVar37;
        local_5a8 = local_5a8 - (dVar37 + dVar37);
        local_358[0] = (double)local_348._8_8_ * 2.5;
        local_358[1] = (double)local_348._8_8_ - dVar39 * dVar34;
        local_348._0_8_ = (double)local_348._8_8_ * 12.0;
        local_338 = ((double)local_568._0_8_ * dVar34 + (double)local_568._0_8_ * dVar34) *
                    (double)local_3e8._0_8_ + (double)local_348._8_8_;
        uVar31 = (undefined4)((ulong)local_348._8_8_ >> 0x20);
        auStack_320._8_4_ = (int)local_348._8_8_;
        auStack_320._0_8_ = local_348._8_8_;
        auStack_320._12_4_ = uVar31;
        auStack_330._8_4_ = (int)local_348._8_8_;
        auStack_330._0_8_ = local_348._8_8_;
        auStack_330._12_4_ = uVar31;
        lVar25 = 0;
        do {
          dVar37 = local_358[lVar25];
          *pdVar23 = *pdVar23 + dVar37;
          pdVar23[3] = pdVar23[3] - (dVar37 + dVar37);
          lVar25 = lVar25 + 1;
          pdVar23 = pdVar23 + 10;
        } while (lVar25 != 9);
        dVar34 = dVar34 * ((double)local_508._0_8_ * (double)local_568._0_8_ *
                           (double)local_3d8._0_8_ -
                          ((double)local_508._0_8_ -
                          ((local_460 - ((double)local_448._0_8_ + (double)local_448._0_8_)) + 1.0)
                          * dVar38) * dVar39 * (double)local_558._0_8_);
        pdVar5[0x5b] = pdVar5[0x5b] + dVar34;
        pdVar5[0x5e] = pdVar5[0x5e] - (dVar34 + dVar34);
        dVar39 = local_4f8[0] * 1.5 + (double)local_2f8._0_8_;
        local_3e8._8_8_ = 0;
        local_3e8._0_8_ = local_4f8[2];
        dVar34 = exp(local_2d8 - dVar36);
        local_558._8_4_ = extraout_XMM0_Dc_02;
        local_558._0_8_ = dVar34 * 4714000.0;
        local_558._12_4_ = extraout_XMM0_Dd_02;
        local_568._8_4_ = local_2c8._8_4_;
        local_568._0_8_ = local_2c8._0_8_ - dVar38;
        local_568._12_4_ = local_2c8._12_4_;
        local_3d8._0_8_ = local_4f8[5];
        dVar34 = exp((local_418 + local_3b8) - (double)local_548._0_8_);
        dVar33 = local_4f8[3];
        dVar34 = (double)local_558._0_8_ / (dVar34 * (double)local_578._0_8_);
        local_358[1] = local_4f8[4] * local_4f8[3] * (double)local_558._0_8_ +
                       -dVar34 * (double)local_3d8._0_8_;
        dVar39 = (double)local_3e8._0_8_ * 11.0 + dVar39;
        dVar37 = dVar39 * local_358[1];
        local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar37;
        local_5a8 = local_5a8 - dVar37;
        auStack_5a0._0_8_ = dVar37 + (double)auStack_5a0._0_8_;
        local_358[0] = local_358[1] * 2.5;
        local_348._8_8_ = (double)local_558._0_8_ * dVar39 * local_4f8[4] + local_358[1];
        local_348._0_8_ = local_358[1] * 12.0;
        local_338 = (double)local_558._0_8_ * dVar39 * local_4f8[3] + local_358[1];
        auStack_330._0_8_ = local_358[1] - dVar34 * dVar39;
        auStack_330._8_8_ = local_358[1];
        auStack_320._0_8_ = local_358[1];
        auStack_320._8_8_ = local_358[1];
        pdVar23 = pdVar5 + 5;
        lVar25 = 0;
        do {
          dVar37 = local_358[lVar25];
          pdVar23[-2] = pdVar23[-2] - dVar37;
          pdVar23[-1] = pdVar23[-1] - dVar37;
          *pdVar23 = dVar37 + *pdVar23;
          lVar25 = lVar25 + 1;
          pdVar23 = pdVar23 + 10;
        } while (lVar25 != 9);
        dVar39 = ((double)local_568._0_8_ * (double)local_558._0_8_ * local_4f8[4] * local_4f8[3] -
                 ((double)local_568._0_8_ -
                 (((double)local_448._8_8_ - (local_450 + (double)local_448._0_8_)) + 1.0) * dVar38)
                 * dVar34 * (double)local_3d8._0_8_) * dVar39;
        auVar7._8_4_ = SUB84(pdVar5[0x5e] - dVar39,0);
        auVar7._0_8_ = pdVar5[0x5d] - dVar39;
        auVar7._12_4_ = (int)((ulong)(pdVar5[0x5e] - dVar39) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x5d) = auVar7;
        pdVar5[0x5f] = dVar39 + pdVar5[0x5f];
        local_508._0_8_ = local_4f8[2];
        local_558._8_8_ = 0;
        local_558._0_8_ = local_4f8[5];
        local_518._0_8_ = local_4f8[3] * local_4f8[5];
        local_3d8._8_4_ = extraout_XMM0_Dc;
        local_3d8._0_8_ = dVar36 + dVar36;
        local_3d8._12_4_ = extraout_XMM0_Dd;
        local_568._0_8_ = local_4f8[2] * 11.0 + local_4f8[0] * 1.5 + (double)local_2f8._0_8_;
        dVar39 = exp(local_2d8 - (dVar36 + dVar36));
        local_528._8_4_ = extraout_XMM0_Dc_03;
        local_528._0_8_ = dVar39 * 38000000000.0;
        local_528._12_4_ = extraout_XMM0_Dd_03;
        local_2f8._8_8_ = 0;
        local_2f8._0_8_ = dVar38 + dVar38;
        local_538._8_4_ = local_2c8._8_4_;
        local_538._0_8_ = local_2c8._0_8_ - (dVar38 + dVar38);
        local_538._12_4_ = local_2c8._12_4_;
        local_3e8._0_8_ = local_418 - local_2b8;
        dVar39 = exp((double)local_548._0_8_ + (local_418 - local_2b8));
        dVar37 = local_4f8[1];
        dVar39 = (double)local_528._0_8_ / ((double)local_578._0_8_ * dVar39);
        local_358[1] = (double)local_528._0_8_ * (double)local_518._0_8_ -
                       (double)local_508._0_8_ * dVar39;
        dVar34 = (double)local_568._0_8_ * local_358[1];
        local_5b8._0_8_ = (double)local_5b8._0_8_ + dVar34;
        local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar34;
        auStack_5a0._0_8_ = (double)auStack_5a0._0_8_ - dVar34;
        local_358[0] = local_358[1] * 2.5;
        dVar34 = local_358[1] +
                 (double)local_558._0_8_ * (double)local_528._0_8_ * (double)local_568._0_8_;
        local_348._8_4_ = SUB84(dVar34,0);
        local_348._0_8_ = -dVar39 * (double)local_568._0_8_ + local_358[1] * 12.0;
        local_348._12_4_ = (int)((ulong)dVar34 >> 0x20);
        local_338 = local_358[1];
        auStack_330._8_8_ = local_358[1];
        auStack_330._0_8_ =
             (double)local_528._0_8_ * (double)local_568._0_8_ * dVar33 + local_358[1];
        auStack_320._8_8_ = local_358[1];
        auStack_320._0_8_ = local_358[1];
        pdVar23 = pdVar5 + 2;
        lVar25 = 0;
        do {
          dVar34 = local_358[lVar25];
          *pdVar23 = *pdVar23 + dVar34;
          pdVar23[1] = pdVar23[1] - dVar34;
          pdVar23[3] = pdVar23[3] - dVar34;
          lVar25 = lVar25 + 1;
          pdVar23 = pdVar23 + 10;
        } while (lVar25 != 9);
        local_568._0_8_ =
             (double)local_568._0_8_ *
             ((double)local_538._0_8_ * (double)local_528._0_8_ * (double)local_518._0_8_ -
             ((double)local_538._0_8_ -
             ((local_458 - (local_450 + (double)local_448._8_8_)) + 1.0) * dVar38) * dVar39 *
             (double)local_508._0_8_);
        pdVar5[0x5c] = pdVar5[0x5c] + (double)local_568._0_8_;
        pdVar5[0x5d] = pdVar5[0x5d] - (double)local_568._0_8_;
        pdVar5[0x5f] = pdVar5[0x5f] - (double)local_568._0_8_;
        local_568._8_8_ = 0;
        local_568._0_8_ = local_4f8[3];
        local_508._0_8_ = local_4f8[1] * local_4f8[3];
        dVar39 = exp(dVar36 * -0.406 + dVar38 * -8352.893435692547);
        local_538._8_4_ = extraout_XMM0_Dc_04;
        local_538._0_8_ = dVar39 * 3547000000.0;
        local_538._12_4_ = extraout_XMM0_Dd_04;
        local_528._8_8_ = 0;
        local_528._0_8_ = dVar38 * -0.406 + local_408 * 8352.893435692547;
        local_578._0_8_ = local_4f8[4];
        local_558._8_8_ = 0;
        local_558._0_8_ = local_4f8[5];
        local_518._0_8_ = local_4f8[4] * local_4f8[5];
        dVar39 = exp(((double)local_498._0_8_ - local_3b8) - (double)local_548._0_8_);
        dVar39 = (double)local_538._0_8_ / dVar39;
        dVar34 = (double)local_538._0_8_ * (double)local_508._0_8_ -
                 (double)local_518._0_8_ * dVar39;
        dVar33 = (double)local_528._0_8_ * (double)local_538._0_8_ * (double)local_508._0_8_ -
                 ((double)local_528._0_8_ -
                 (((double)local_448._0_8_ + (double)local_448._8_8_) - (local_460 + local_450)) *
                 dVar38) * dVar39 * (double)local_518._0_8_;
        local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar34;
        local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar34;
        local_5a8 = dVar34 + local_5a8;
        auStack_5a0._0_8_ = dVar34 + (double)auStack_5a0._0_8_;
        dVar34 = (double)local_568._0_8_ * (double)local_538._0_8_;
        pdVar5[0xb] = pdVar5[0xb] - dVar34;
        pdVar5[0xd] = pdVar5[0xd] - dVar34;
        pdVar5[0xe] = dVar34 + pdVar5[0xe];
        pdVar5[0xf] = dVar34 + pdVar5[0xf];
        dVar37 = (double)local_538._0_8_ * dVar37;
        pdVar5[0x1f] = pdVar5[0x1f] - dVar37;
        pdVar5[0x21] = pdVar5[0x21] - dVar37;
        pdVar5[0x22] = dVar37 + pdVar5[0x22];
        pdVar5[0x23] = dVar37 + pdVar5[0x23];
        dVar34 = (double)local_558._0_8_ * -dVar39;
        pdVar5[0x29] = pdVar5[0x29] - dVar34;
        pdVar5[0x2b] = pdVar5[0x2b] - dVar34;
        pdVar5[0x2c] = dVar34 + pdVar5[0x2c];
        pdVar5[0x2d] = dVar34 + pdVar5[0x2d];
        dVar39 = -dVar39 * (double)local_578._0_8_;
        pdVar5[0x33] = pdVar5[0x33] - dVar39;
        pdVar5[0x35] = pdVar5[0x35] - dVar39;
        auVar12._8_4_ = SUB84(dVar39 + pdVar5[0x37],0);
        auVar12._0_8_ = dVar39 + pdVar5[0x36];
        auVar12._12_4_ = (int)((ulong)(dVar39 + pdVar5[0x37]) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x36) = auVar12;
        pdVar5[0x5b] = pdVar5[0x5b] - dVar33;
        pdVar5[0x5d] = pdVar5[0x5d] - dVar33;
        auVar13._8_4_ = SUB84(dVar33 + pdVar5[0x5f],0);
        auVar13._0_8_ = dVar33 + pdVar5[0x5e];
        auVar13._12_4_ = (int)((ulong)(dVar33 + pdVar5[0x5f]) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x5e) = auVar13;
        local_578._0_8_ = (double)local_578._0_8_ * local_4f8[0];
        dVar39 = exp(dVar36 * 2.67 + dVar38 * -3165.232827911689);
        local_558._0_8_ = dVar39 * 0.0508;
        local_498._8_8_ = 0;
        local_498._0_8_ = dVar38 * 2.67 + local_408 * 3165.232827911689;
        dVar39 = local_4f8[3] * local_4f8[5];
        dVar34 = exp(((local_398 - local_418) + local_3b8) - (double)local_548._0_8_);
        dVar34 = (double)local_558._0_8_ / dVar34;
        dVar37 = (double)local_558._0_8_ * (double)local_578._0_8_ - dVar39 * dVar34;
        local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar37;
        local_5b8._8_8_ = (double)local_5b8._8_8_ + dVar37;
        local_5a8 = local_5a8 - dVar37;
        auStack_5a0._0_8_ = dVar37 + (double)auStack_5a0._0_8_;
        dVar37 = local_4f8[4] * (double)local_558._0_8_;
        *pdVar5 = *pdVar5 - dVar37;
        pdVar5[3] = pdVar5[3] + dVar37;
        pdVar5[4] = pdVar5[4] - dVar37;
        dVar33 = (double)local_498._0_8_ * (double)local_558._0_8_ * (double)local_578._0_8_ -
                 ((double)local_498._0_8_ -
                 ((local_450 + (double)local_448._8_8_) - (local_468 + (double)local_448._0_8_)) *
                 dVar38) * dVar34 * dVar39;
        pdVar5[5] = dVar37 + pdVar5[5];
        dVar39 = local_4f8[5] * -dVar34;
        pdVar5[0x1e] = pdVar5[0x1e] - dVar39;
        pdVar5[0x21] = pdVar5[0x21] + dVar39;
        pdVar5[0x22] = pdVar5[0x22] - dVar39;
        pdVar5[0x23] = dVar39 + pdVar5[0x23];
        dVar39 = (double)local_558._0_8_ * local_4f8[0];
        pdVar5[0x28] = pdVar5[0x28] - dVar39;
        pdVar5[0x2b] = pdVar5[0x2b] + dVar39;
        pdVar5[0x2c] = pdVar5[0x2c] - dVar39;
        pdVar5[0x2d] = dVar39 + pdVar5[0x2d];
        local_578._0_8_ = local_4f8[3];
        dVar39 = -dVar34 * local_4f8[3];
        pdVar5[0x32] = pdVar5[0x32] - dVar39;
        pdVar5[0x35] = pdVar5[0x35] + dVar39;
        pdVar5[0x36] = pdVar5[0x36] - dVar39;
        pdVar5[0x37] = dVar39 + pdVar5[0x37];
        pdVar5[0x5a] = pdVar5[0x5a] - dVar33;
        pdVar5[0x5d] = pdVar5[0x5d] + dVar33;
        pdVar5[0x5e] = pdVar5[0x5e] - dVar33;
        pdVar5[0x5f] = dVar33 + pdVar5[0x5f];
        dVar37 = local_4f8[5] * local_4f8[0];
        dVar39 = exp(dVar36 * 1.51 + dVar38 * -1726.0331637101897);
        local_558._8_4_ = extraout_XMM0_Dc_05;
        local_558._0_8_ = dVar39 * 216.0;
        local_558._12_4_ = extraout_XMM0_Dd_05;
        local_498._8_8_ = 0;
        local_498._0_8_ = dVar38 * 1.51 + local_408 * 1726.0331637101897;
        local_578._0_8_ = (double)local_578._0_8_ * local_4f8[2];
        dVar39 = exp(((local_398 - local_2b8) - local_418) + (double)local_548._0_8_);
        dVar39 = (double)local_558._0_8_ / dVar39;
        dVar34 = (double)local_558._0_8_ * dVar37 - (double)local_578._0_8_ * dVar39;
        dVar33 = (double)local_498._0_8_ * (double)local_558._0_8_ * dVar37 -
                 ((double)local_498._0_8_ -
                 ((local_458 + local_450) - (local_468 + (double)local_448._8_8_)) * dVar38) *
                 dVar39 * (double)local_578._0_8_;
        local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar34;
        auStack_5a0._0_8_ = (double)auStack_5a0._0_8_ - dVar34;
        dVar37 = dVar34 + (double)local_5b8._8_8_;
        local_5b8._8_4_ = SUB84(dVar37,0);
        local_5b8._0_8_ = dVar34 + (double)local_5b8._0_8_;
        local_5b8._12_4_ = (int)((ulong)dVar37 >> 0x20);
        dVar34 = local_4f8[5] * (double)local_558._0_8_;
        *pdVar5 = *pdVar5 - dVar34;
        pdVar5[2] = dVar34 + pdVar5[2];
        pdVar5[3] = dVar34 + pdVar5[3];
        pdVar5[5] = pdVar5[5] - dVar34;
        dVar34 = local_4f8[3] * -dVar39;
        pdVar5[0x14] = pdVar5[0x14] - dVar34;
        pdVar5[0x16] = dVar34 + pdVar5[0x16];
        pdVar5[0x17] = dVar34 + pdVar5[0x17];
        pdVar5[0x19] = pdVar5[0x19] - dVar34;
        local_558._0_8_ = (double)local_558._0_8_ * local_4f8[0];
        pdVar5[0x32] = pdVar5[0x32] - (double)local_558._0_8_;
        pdVar5[0x34] = (double)local_558._0_8_ + pdVar5[0x34];
        pdVar5[0x35] = (double)local_558._0_8_ + pdVar5[0x35];
        pdVar5[0x37] = pdVar5[0x37] - (double)local_558._0_8_;
        pdVar5[0x5a] = pdVar5[0x5a] - dVar33;
        pdVar5[0x5c] = dVar33 + pdVar5[0x5c];
        pdVar5[0x5d] = dVar33 + pdVar5[0x5d];
        pdVar5[0x5f] = pdVar5[0x5f] - dVar33;
        local_4a8._8_8_ = 0;
        local_4a8._0_8_ = local_4f8[2];
        local_508._8_8_ = 0;
        local_508._0_8_ = local_4f8[4];
        local_3a8 = dVar38 * 2.02 + local_408 * 6743.103321783248;
        uStack_3a0 = 0;
        dVar39 = -dVar39 * local_4f8[2];
        pdVar5[0x1e] = pdVar5[0x1e] - dVar39;
        local_578._0_8_ = (double)local_548._0_8_ * -2.0;
        local_518._0_8_ = local_2b8 + local_3b8 + (double)local_578._0_8_;
        local_568._8_8_ = 0;
        local_568._0_8_ = dVar38 * -414.1473159572846 + (double)local_378._0_8_;
        pdVar5[0x20] = dVar39 + pdVar5[0x20];
        pdVar5[0x21] = dVar39 + pdVar5[0x21];
        local_498._0_8_ = local_408 * 414.1473159572846 + (double)local_368._0_8_;
        local_498._8_8_ = uStack_400;
        pdVar5[0x23] = pdVar5[0x23] - dVar39;
        local_558._8_4_ = SUB84(dStack_390,0);
        local_558._0_8_ = (-local_398 - local_478) + local_418 + (double)local_388._0_8_;
        local_558._12_4_ = (uint)((ulong)dStack_390 >> 0x20) ^ 0x80000000;
        dVar36 = exp(dVar36 * 2.02 + dVar38 * -6743.103321783248);
        dVar36 = dVar36 * 2.97;
        auVar8._8_4_ = extraout_XMM0_Dc_06;
        auVar8._0_8_ = dVar36;
        auVar8._12_4_ = extraout_XMM0_Dd_06;
        local_538._0_8_ = local_4f8[5];
        dVar39 = local_4f8[5] * local_4f8[5];
        local_3f8._0_8_ = exp((double)local_518._0_8_);
        uStack_5d0 = auVar8._8_8_;
        local_3f8._0_8_ = dVar36 / (double)local_3f8._0_8_;
        local_528._8_4_ = SUB84(local_4f8[6] * local_4f8[3],0);
        local_528._0_8_ = (double)local_508._0_8_ * (double)local_4a8._0_8_;
        local_528._12_4_ = (int)((ulong)(local_4f8[6] * local_4f8[3]) >> 0x20);
        local_518._0_8_ = local_5a8;
        dVar34 = (double)local_508._0_8_ * dVar36;
        pdVar5[0x16] = pdVar5[0x16] - dVar34;
        local_3f8._8_8_ = uStack_5d0;
        pdVar5[0x18] = pdVar5[0x18] - dVar34;
        pdVar5[0x19] = dVar34 + dVar34 + pdVar5[0x19];
        dVar34 = (double)local_4a8._0_8_ * dVar36;
        pdVar5[0x2a] = pdVar5[0x2a] - dVar34;
        pdVar5[0x2c] = pdVar5[0x2c] - dVar34;
        pdVar5[0x2d] = dVar34 + dVar34 + pdVar5[0x2d];
        dVar34 = (double)local_3f8._0_8_ * -2.0 * (double)local_538._0_8_;
        pdVar5[0x34] = pdVar5[0x34] - dVar34;
        pdVar5[0x36] = pdVar5[0x36] - dVar34;
        dVar37 = local_3a8 * dVar36 * (double)local_508._0_8_ * (double)local_4a8._0_8_ -
                 (local_3a8 -
                 (((double)local_448._8_8_ + (double)local_448._8_8_) -
                 (local_458 + (double)local_448._0_8_)) * dVar38) * (double)local_3f8._0_8_ * dVar39
        ;
        pdVar5[0x37] = dVar34 + dVar34 + pdVar5[0x37];
        pdVar5[0x5c] = pdVar5[0x5c] - dVar37;
        pdVar5[0x5e] = pdVar5[0x5e] - dVar37;
        pdVar5[0x5f] = dVar37 + dVar37 + pdVar5[0x5f];
        dVar34 = exp((double)local_568._0_8_);
        local_538._8_4_ = extraout_XMM0_Dc_07;
        local_538._0_8_ = dVar34 * 16600000.0;
        local_538._12_4_ = extraout_XMM0_Dd_07;
        local_568._8_8_ = 0;
        local_568._0_8_ = local_4f8[1];
        local_508._8_8_ = 0;
        local_508._0_8_ = local_4f8[0] * local_4f8[1];
        dVar34 = exp((double)local_558._0_8_);
        dVar34 = (double)local_538._0_8_ / dVar34;
        dVar39 = dVar36 * (double)local_528._0_8_ - dVar39 * (double)local_3f8._0_8_;
        dVar37 = (double)local_538._0_8_ * (double)local_528._8_8_ -
                 (double)local_508._0_8_ * dVar34;
        local_5a8 = (double)local_518._0_8_ - dVar39;
        auStack_5a0._0_8_ = dVar39 + dVar39 + (double)auStack_5a0._0_8_;
        dVar33 = (double)local_528._8_8_ * (double)local_498._0_8_ * (double)local_538._0_8_ -
                 ((double)local_498._0_8_ -
                 ((local_468 + local_460) - (local_450 + local_438)) * dVar38) * dVar34 *
                 (double)local_508._0_8_;
        dVar36 = (double)local_5c8._8_8_ + dVar37;
        local_5c8._8_4_ = SUB84(dVar36,0);
        local_5c8._0_8_ = (double)local_5c8._0_8_ + dVar37;
        local_5c8._12_4_ = (int)((ulong)dVar36 >> 0x20);
        dVar36 = (double)local_5b8._8_8_ - dVar37;
        local_5b8._8_4_ = SUB84(dVar36,0);
        local_5b8._0_8_ = (double)local_5b8._0_8_ - dVar39;
        local_5b8._12_4_ = (int)((ulong)dVar36 >> 0x20);
        auStack_5a0._8_8_ = (double)auStack_5a0._8_8_ - dVar37;
        local_568._0_8_ = (double)local_568._0_8_ * -dVar34;
        *pdVar5 = (double)local_568._0_8_ + *pdVar5;
        pdVar5[1] = (double)local_568._0_8_ + pdVar5[1];
        pdVar5[3] = pdVar5[3] - (double)local_568._0_8_;
        pdVar5[6] = pdVar5[6] - (double)local_568._0_8_;
        dVar36 = local_4f8[0] * -dVar34;
        pdVar5[10] = dVar36 + pdVar5[10];
        pdVar5[0xb] = dVar36 + pdVar5[0xb];
        pdVar5[0xd] = pdVar5[0xd] - dVar36;
        pdVar5[0x10] = pdVar5[0x10] - dVar36;
        dVar36 = (double)local_538._0_8_ * local_4f8[3];
        local_4a8._0_8_ = local_4f8[3];
        pdVar5[0x3c] = dVar36 + pdVar5[0x3c];
        pdVar5[0x3d] = dVar36 + pdVar5[0x3d];
        pdVar5[0x3f] = pdVar5[0x3f] - dVar36;
        pdVar5[0x42] = pdVar5[0x42] - dVar36;
        pdVar5[0x5a] = dVar33 + pdVar5[0x5a];
        pdVar5[0x5b] = dVar33 + pdVar5[0x5b];
        pdVar5[0x5d] = pdVar5[0x5d] - dVar33;
        pdVar5[0x60] = pdVar5[0x60] - dVar33;
        dVar36 = local_3b8 - local_478;
        dVar39 = (double)local_538._0_8_ * local_4f8[6];
        local_478 = local_4f8[6];
        dStack_470 = 0.0;
        local_498._0_8_ = local_408 * 148.4489164123924 + (double)local_368._0_8_;
        local_498._8_8_ = uStack_400;
        local_578._0_8_ = (double)local_578._0_8_ + local_418 + (double)local_388._0_8_;
        local_2d8 = local_2d8 + (double)local_378._0_8_;
        local_2c8._0_8_ = (double)local_2c8._0_8_ + (double)local_368._0_8_;
        local_528._0_8_ = (dVar36 - (double)local_548._0_8_) + (double)local_388._0_8_;
        pdVar5[0x1e] = dVar39 + pdVar5[0x1e];
        pdVar5[0x1f] = dVar39 + pdVar5[0x1f];
        local_558._8_8_ = 0;
        local_558._0_8_ = dVar38 * 250.09868290494586 + (double)local_378._0_8_;
        pdVar5[0x21] = pdVar5[0x21] - dVar39;
        dVar33 = local_408 * -250.09868290494586 + (double)local_368._0_8_;
        pdVar5[0x24] = pdVar5[0x24] - dVar39;
        local_568._8_8_ = 0;
        local_568._0_8_ = local_4f8[6] * local_4f8[3];
        local_508._0_8_ =
             ((double)local_488._0_8_ - local_2b8) + (double)local_548._0_8_ +
             (double)local_388._0_8_;
        dVar36 = exp(dVar38 * -148.4489164123924 + (double)local_378._0_8_);
        dVar34 = local_4f8[5];
        local_308._0_8_ = dVar36 * 70790000.0;
        local_3f8._0_8_ = local_4f8[5] * local_4f8[5];
        dVar36 = exp((double)local_578._0_8_);
        dVar36 = (double)local_308._0_8_ / dVar36;
        local_538._0_8_ = local_448._8_8_;
        local_3a8 = local_438;
        dVar39 = (double)local_498._0_8_ -
                 (((double)local_448._8_8_ + (double)local_448._8_8_) - (local_450 + local_438)) *
                 dVar38;
        local_518._0_8_ =
             (double)local_308._0_8_ * (double)local_568._0_8_ - (double)local_3f8._0_8_ * dVar36;
        dVar37 = (double)local_498._0_8_ * (double)local_308._0_8_;
        local_518._8_8_ = 0;
        local_498._8_8_ = 0;
        local_498._0_8_ =
             (double)local_518._0_8_ + (double)local_518._0_8_ + (double)auStack_5a0._0_8_;
        dVar37 = dVar37 * (double)local_568._0_8_ - dVar39 * dVar36 * (double)local_3f8._0_8_;
        dVar39 = (double)local_308._0_8_ * local_478;
        pdVar5[0x21] = pdVar5[0x21] - dVar39;
        local_568._8_8_ = 0;
        local_568._0_8_ = (double)auStack_5a0._8_8_ - (double)local_518._0_8_;
        pdVar5[0x23] = dVar39 + dVar39 + pdVar5[0x23];
        pdVar5[0x24] = pdVar5[0x24] - dVar39;
        dVar36 = dVar36 * -2.0 * dVar34;
        pdVar5[0x35] = pdVar5[0x35] - dVar36;
        pdVar5[0x37] = dVar36 + dVar36 + pdVar5[0x37];
        pdVar5[0x38] = pdVar5[0x38] - dVar36;
        local_4a8._0_8_ = (double)local_308._0_8_ * (double)local_4a8._0_8_;
        pdVar5[0x3f] = pdVar5[0x3f] - (double)local_4a8._0_8_;
        pdVar5[0x41] = (double)local_4a8._0_8_ + (double)local_4a8._0_8_ + pdVar5[0x41];
        pdVar5[0x42] = pdVar5[0x42] - (double)local_4a8._0_8_;
        pdVar5[0x5d] = pdVar5[0x5d] - dVar37;
        pdVar5[0x5f] = dVar37 + dVar37 + pdVar5[0x5f];
        pdVar5[0x60] = pdVar5[0x60] - dVar37;
        local_3f8._8_8_ = 0;
        local_3f8._0_8_ = local_4f8[4];
        dVar36 = exp(local_2d8);
        local_578._8_4_ = extraout_XMM0_Dc_08;
        local_578._0_8_ = dVar36 * 32500000.0;
        local_578._12_4_ = extraout_XMM0_Dd_08;
        local_4a8._0_8_ = local_4f8[1];
        dVar34 = dVar34 * local_4f8[1];
        dVar36 = exp((double)local_528._0_8_);
        dVar39 = (double)local_538._0_8_ + local_460;
        local_538._0_8_ = -((double)local_578._0_8_ / dVar36);
        local_538._8_8_ = local_578._8_8_ ^ 0x8000000000000000;
        dStack_470 = (double)local_3f8._0_8_ * local_478;
        dVar36 = dStack_470 * (double)local_2c8._0_8_ * (double)local_578._0_8_ -
                 ((double)local_2c8._0_8_ -
                 (dVar39 - (local_3a8 + (double)local_448._0_8_)) * dVar38) *
                 ((double)local_578._0_8_ / dVar36) * dVar34;
        local_528._0_8_ = local_5c8._8_8_;
        dVar39 = local_4f8[5] * (double)local_538._0_8_;
        pdVar5[0xb] = pdVar5[0xb] + dVar39;
        pdVar5[0xe] = pdVar5[0xe] - dVar39;
        pdVar5[0xf] = dVar39 + pdVar5[0xf];
        pdVar5[0x10] = pdVar5[0x10] - dVar39;
        dVar39 = local_4f8[6] * (double)local_578._0_8_;
        pdVar5[0x29] = pdVar5[0x29] + dVar39;
        pdVar5[0x2c] = pdVar5[0x2c] - dVar39;
        pdVar5[0x2d] = pdVar5[0x2d] + dVar39;
        pdVar5[0x2e] = pdVar5[0x2e] - dVar39;
        local_4a8._0_8_ = (double)local_4a8._0_8_ * (double)local_538._0_8_;
        pdVar5[0x33] = pdVar5[0x33] + (double)local_4a8._0_8_;
        pdVar5[0x36] = pdVar5[0x36] - (double)local_4a8._0_8_;
        pdVar5[0x37] = pdVar5[0x37] + (double)local_4a8._0_8_;
        pdVar5[0x38] = pdVar5[0x38] - (double)local_4a8._0_8_;
        dVar39 = (double)local_3f8._0_8_ * (double)local_578._0_8_;
        pdVar5[0x3d] = pdVar5[0x3d] + dVar39;
        pdVar5[0x40] = pdVar5[0x40] - dVar39;
        pdVar5[0x41] = pdVar5[0x41] + dVar39;
        pdVar5[0x42] = pdVar5[0x42] - dVar39;
        pdVar5[0x5b] = pdVar5[0x5b] + dVar36;
        pdVar5[0x5e] = pdVar5[0x5e] - dVar36;
        pdVar5[0x5f] = pdVar5[0x5f] + dVar36;
        pdVar5[0x60] = pdVar5[0x60] - dVar36;
        local_478 = local_4f8[6] * local_4f8[5];
        dVar36 = exp((double)local_558._0_8_);
        local_308._8_4_ = extraout_XMM0_Dc_09;
        local_308._0_8_ = dVar36 * 28900000.0;
        local_308._12_4_ = extraout_XMM0_Dd_09;
        local_3a8 = local_4f8[1];
        local_4a8._8_8_ = 0;
        local_4a8._0_8_ = local_4f8[2];
        local_3f8._8_8_ = 0;
        local_3f8._0_8_ = local_4f8[1] * local_4f8[2];
        dVar36 = exp((double)local_508._0_8_);
        dVar37 = local_4f8[6];
        dVar39 = -((double)local_308._0_8_ / dVar36);
        local_558._0_8_ = (double)local_308._0_8_ * local_478 + dVar39 * (double)local_3f8._0_8_;
        local_558._8_8_ = (double)local_578._0_8_ * dStack_470 + (double)local_538._0_8_ * dVar34;
        local_5a8 = local_5a8 - (double)local_558._8_8_;
        dVar34 = dVar33 * (double)local_308._0_8_ * local_478 -
                 (dVar33 - ((local_460 + local_458) - ((double)local_448._8_8_ + local_438)) *
                           dVar38) * ((double)local_308._0_8_ / dVar36) * (double)local_3f8._0_8_;
        local_5c8._8_8_ =
             (double)local_558._0_8_ + (double)local_528._0_8_ + (double)local_558._8_8_;
        local_5b8._0_8_ = (double)local_558._0_8_ + (double)local_5b8._0_8_;
        auStack_5a0._8_4_ = SUB84((double)local_568._0_8_ - (double)local_558._8_8_,0);
        auStack_5a0._0_8_ =
             ((double)local_558._8_8_ + (double)local_498._0_8_) - (double)local_558._0_8_;
        auStack_5a0._12_4_ =
             (int)((ulong)((double)local_568._0_8_ - (double)local_558._8_8_) >> 0x20);
        local_568._8_8_ = dStack_590;
        local_568._0_8_ = auStack_5a0._8_8_;
        dVar36 = (double)local_4a8._0_8_ * dVar39;
        auVar14._8_4_ = SUB84(pdVar5[0xc] + dVar36,0);
        auVar14._0_8_ = pdVar5[0xb] + dVar36;
        auVar14._12_4_ = (int)((ulong)(pdVar5[0xc] + dVar36) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0xb) = auVar14;
        pdVar5[0xf] = pdVar5[0xf] - dVar36;
        pdVar5[0x10] = pdVar5[0x10] - dVar36;
        dVar39 = dVar39 * local_3a8;
        pdVar5[0x15] = pdVar5[0x15] + dVar39;
        pdVar5[0x16] = pdVar5[0x16] + dVar39;
        pdVar5[0x19] = pdVar5[0x19] - dVar39;
        pdVar5[0x1a] = pdVar5[0x1a] - dVar39;
        dVar36 = (double)local_308._0_8_ * local_4f8[6];
        auVar15._8_4_ = SUB84(pdVar5[0x34] + dVar36,0);
        auVar15._0_8_ = pdVar5[0x33] + dVar36;
        auVar15._12_4_ = (int)((ulong)(pdVar5[0x34] + dVar36) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x33) = auVar15;
        auVar16._8_4_ = SUB84(pdVar5[0x38] - dVar36,0);
        auVar16._0_8_ = pdVar5[0x37] - dVar36;
        auVar16._12_4_ = (int)((ulong)(pdVar5[0x38] - dVar36) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x37) = auVar16;
        dVar36 = (double)local_308._0_8_ * local_4f8[5];
        auVar9._8_4_ = SUB84(pdVar5[0x3e] + dVar36,0);
        auVar9._0_8_ = pdVar5[0x3d] + dVar36;
        auVar9._12_4_ = (int)((ulong)(pdVar5[0x3e] + dVar36) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x3d) = auVar9;
        auVar10._8_4_ = SUB84(pdVar5[0x42] - dVar36,0);
        auVar10._0_8_ = pdVar5[0x41] - dVar36;
        auVar10._12_4_ = (int)((ulong)(pdVar5[0x42] - dVar36) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x41) = auVar10;
        pdVar5[0x5b] = pdVar5[0x5b] + dVar34;
        pdVar5[0x5c] = pdVar5[0x5c] + dVar34;
        auVar11._8_4_ = SUB84(pdVar5[0x60] - dVar34,0);
        auVar11._0_8_ = pdVar5[0x5f] - dVar34;
        auVar11._12_4_ = (int)((ulong)(pdVar5[0x60] - dVar34) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x5f) = auVar11;
        local_5b8._8_8_ = (double)local_5b8._8_8_ - (double)local_518._0_8_;
        local_528._0_8_ = exp(dVar38 * -6029.542089672155 + (double)local_378._0_8_);
        dVar34 = local_4f8[7];
        local_528._0_8_ = (double)local_528._0_8_ * 420000000.0;
        local_518._8_4_ = (int)uStack_400;
        local_518._0_8_ = local_408 * 6029.542089672155 + (double)local_368._0_8_;
        local_518._12_4_ = (int)((ulong)uStack_400 >> 0x20);
        local_498._0_8_ = local_4f8[1];
        local_538._0_8_ =
             ((double)local_388._0_8_ + (double)local_388._0_8_ + (double)local_488._0_8_) -
             (double)local_3c8._0_8_;
        dVar36 = exp((double)local_538._0_8_);
        dVar36 = (double)local_528._0_8_ / dVar36;
        local_2a8 = ((local_460 + local_430) - (local_438 + local_438)) * dVar38;
        dVar39 = (double)local_518._0_8_ - local_2a8;
        dVar33 = dVar34 * -dVar36;
        local_478 = dVar37 * dVar37;
        local_578._0_8_ = (double)local_498._0_8_ * dVar34;
        local_578._8_8_ = 0;
        pdVar5[0xb] = pdVar5[0xb] + dVar33;
        pdVar5[0x10] = pdVar5[0x10] - (dVar33 + dVar33);
        dStack_470 = 0.0;
        local_508._0_8_ = (double)local_528._0_8_ * local_478 - dVar36 * (double)local_578._0_8_;
        pdVar5[0x11] = dVar33 + pdVar5[0x11];
        dVar33 = (double)local_518._0_8_ * (double)local_528._0_8_;
        dVar37 = ((double)local_528._0_8_ + (double)local_528._0_8_) * dVar37;
        pdVar5[0x3d] = pdVar5[0x3d] + dVar37;
        local_518._8_8_ = 0;
        local_518._0_8_ = (double)local_5c8._8_8_ + (double)local_508._0_8_;
        local_528._8_8_ = 0;
        local_528._0_8_ = dStack_590 + (double)local_508._0_8_;
        pdVar5[0x42] = pdVar5[0x42] - (dVar37 + dVar37);
        pdVar5[0x43] = dVar37 + pdVar5[0x43];
        local_498._0_8_ = -dVar36 * (double)local_498._0_8_;
        pdVar5[0x47] = pdVar5[0x47] + (double)local_498._0_8_;
        pdVar5[0x4c] = pdVar5[0x4c] - ((double)local_498._0_8_ + (double)local_498._0_8_);
        pdVar5[0x4d] = (double)local_498._0_8_ + pdVar5[0x4d];
        local_4a8._0_8_ = local_408 * -819.8909135956303 + (double)local_368._0_8_;
        local_4a8._8_8_ = uStack_400;
        local_2a8 = (double)local_4a8._0_8_ - local_2a8;
        uStack_2a0 = uStack_400;
        dVar36 = dVar33 * local_478 - dVar39 * dVar36 * (double)local_578._0_8_;
        pdVar5[0x5b] = pdVar5[0x5b] + dVar36;
        local_498._8_8_ = 0;
        local_498._0_8_ = dVar38 * -1997.7701632447386;
        local_3f8._8_4_ = local_378._8_4_;
        local_3f8._0_8_ = local_378._0_8_ + dVar38 * -1997.7701632447386;
        local_3f8._12_4_ = local_378._12_4_;
        pdVar5[0x60] = pdVar5[0x60] - (dVar36 + dVar36);
        dVar33 = local_408 * 1997.7701632447386;
        pdVar5[0x61] = pdVar5[0x61] + dVar36;
        local_3a8 = (double)local_368._0_8_ + dVar33;
        uStack_3a0 = local_368._8_8_;
        local_3e8._0_8_ =
             ((double)local_3e8._0_8_ - (double)local_548._0_8_) + (double)local_3c8._0_8_;
        dVar36 = exp(dVar38 * 819.8909135956303 + local_378._0_8_);
        local_488._8_4_ = extraout_XMM0_Dc_10;
        local_488._0_8_ = dVar36 * 130000.0;
        local_488._12_4_ = extraout_XMM0_Dd_10;
        dVar36 = exp((double)local_538._0_8_);
        local_308._0_8_ = -((double)local_488._0_8_ / dVar36);
        dVar39 = dVar34 * (double)local_308._0_8_;
        local_308._8_8_ = local_488._8_8_ ^ 0x8000000000000000;
        pdVar5[0xb] = pdVar5[0xb] + dVar39;
        pdVar5[0x10] = pdVar5[0x10] - (dVar39 + dVar39);
        pdVar5[0x11] = dVar39 + pdVar5[0x11];
        dVar39 = ((double)local_488._0_8_ + (double)local_488._0_8_) * local_4f8[6];
        pdVar5[0x3d] = pdVar5[0x3d] + dVar39;
        pdVar5[0x42] = pdVar5[0x42] - (dVar39 + dVar39);
        pdVar5[0x43] = dVar39 + pdVar5[0x43];
        dVar39 = local_4f8[1] * (double)local_308._0_8_;
        pdVar5[0x47] = pdVar5[0x47] + dVar39;
        pdVar5[0x4c] = pdVar5[0x4c] - (dVar39 + dVar39);
        dVar36 = (double)local_4a8._0_8_ * (double)local_488._0_8_ * local_478 -
                 ((double)local_488._0_8_ / dVar36) * local_2a8 * (double)local_578._0_8_;
        pdVar5[0x4d] = dVar39 + pdVar5[0x4d];
        pdVar5[0x5b] = pdVar5[0x5b] + dVar36;
        pdVar5[0x60] = pdVar5[0x60] - (dVar36 + dVar36);
        pdVar5[0x61] = dVar36 + pdVar5[0x61];
        local_538._0_8_ = local_4f8[3];
        dVar34 = dVar34 * local_4f8[3];
        dVar36 = exp((double)local_3f8._0_8_);
        local_1d8._8_4_ = extraout_XMM0_Dc_11;
        local_1d8._0_8_ = dVar36 * 24100000.0;
        local_1d8._12_4_ = extraout_XMM0_Dd_11;
        local_4a8._0_8_ = local_4f8[2];
        local_3f8._0_8_ = local_4f8[5];
        local_2a8 = local_4f8[2] * local_4f8[5];
        uStack_2a0 = 0;
        dVar36 = exp((double)local_3e8._0_8_);
        dVar39 = -((double)local_1d8._0_8_ / dVar36);
        dVar37 = local_478 * (double)local_488._0_8_ +
                 (double)local_308._0_8_ * (double)local_578._0_8_;
        dStack_590 = dVar34 * (double)local_1d8._0_8_ + dVar39 * local_2a8;
        local_5c8._8_8_ = (double)local_518._0_8_ + dVar37;
        local_5b8._0_8_ = (double)local_5b8._0_8_ + dStack_590;
        local_5b8._8_8_ = (double)local_5b8._8_8_ - dStack_590;
        auStack_5a0._0_8_ = (double)auStack_5a0._0_8_ + dStack_590;
        dStack_590 = ((double)local_528._0_8_ + dVar37) - dStack_590;
        auStack_5a0._8_8_ =
             (((double)local_568._0_8_ - (double)local_558._0_8_) -
             ((double)local_508._0_8_ + (double)local_508._0_8_)) - (dVar37 + dVar37);
        dVar37 = (double)local_3f8._0_8_ * dVar39;
        pdVar5[0x16] = pdVar5[0x16] + dVar37;
        pdVar5[0x17] = pdVar5[0x17] - dVar37;
        dVar34 = local_3a8 * (double)local_1d8._0_8_ * dVar34 -
                 (local_3a8 -
                 ((local_458 + (double)local_448._8_8_) - (local_450 + local_430)) * dVar38) *
                 ((double)local_1d8._0_8_ / dVar36) * local_2a8;
        pdVar5[0x19] = dVar37 + pdVar5[0x19];
        pdVar5[0x1b] = pdVar5[0x1b] - dVar37;
        dVar36 = (double)local_1d8._0_8_ * local_4f8[7];
        pdVar5[0x20] = pdVar5[0x20] + dVar36;
        pdVar5[0x21] = pdVar5[0x21] - dVar36;
        pdVar5[0x23] = pdVar5[0x23] + dVar36;
        pdVar5[0x25] = pdVar5[0x25] - dVar36;
        dVar39 = dVar39 * (double)local_4a8._0_8_;
        pdVar5[0x34] = pdVar5[0x34] + dVar39;
        pdVar5[0x35] = pdVar5[0x35] - dVar39;
        pdVar5[0x37] = pdVar5[0x37] + dVar39;
        pdVar5[0x39] = pdVar5[0x39] - dVar39;
        dVar36 = (double)local_1d8._0_8_ * (double)local_538._0_8_;
        pdVar5[0x48] = pdVar5[0x48] + dVar36;
        pdVar5[0x49] = pdVar5[0x49] - dVar36;
        pdVar5[0x4b] = pdVar5[0x4b] + dVar36;
        pdVar5[0x4d] = pdVar5[0x4d] - dVar36;
        pdVar5[0x5c] = pdVar5[0x5c] + dVar34;
        pdVar5[0x5d] = pdVar5[0x5d] - dVar34;
        pdVar5[0x5f] = pdVar5[0x5f] + dVar34;
        pdVar5[0x61] = pdVar5[0x61] - dVar34;
        local_478 = local_4f8[7] * (double)local_538._0_8_;
        dVar36 = exp(dVar38 * -4000.5724931475243 + (double)local_378._0_8_);
        dVar39 = local_4f8[6];
        local_488._0_8_ = dVar36 * 48200000.0;
        local_3e8._8_4_ = (int)uStack_400;
        local_3e8._0_8_ = local_408 * 4000.5724931475243 + (double)local_368._0_8_;
        local_3e8._12_4_ = (int)((ulong)uStack_400 >> 0x20);
        local_578._0_8_ = local_4f8[0] * local_4f8[6];
        dVar36 = exp(((local_418 - local_398) - (double)local_388._0_8_) + (double)local_3c8._0_8_);
        dVar34 = local_4f8[7];
        dVar36 = (double)local_488._0_8_ / dVar36;
        dVar37 = (double)local_488._0_8_ * local_478 - (double)local_578._0_8_ * dVar36;
        local_5c8._0_8_ = (double)local_5c8._0_8_ + dVar37;
        local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar37;
        dStack_590 = dStack_590 - dVar37;
        auStack_5a0._8_8_ = dVar37 + (double)auStack_5a0._8_8_;
        dVar37 = (double)local_3e8._0_8_ * (double)local_488._0_8_ * local_478 -
                 ((double)local_3e8._0_8_ -
                 ((local_468 + local_438) - (local_450 + local_430)) * dVar38) * dVar36 *
                 (double)local_578._0_8_;
        dVar39 = -dVar36 * dVar39;
        *pdVar5 = *pdVar5 + dVar39;
        pdVar5[3] = pdVar5[3] - dVar39;
        pdVar5[6] = dVar39 + pdVar5[6];
        pdVar5[7] = pdVar5[7] - dVar39;
        dVar39 = (double)local_488._0_8_ * local_4f8[7];
        pdVar5[0x1e] = pdVar5[0x1e] + dVar39;
        pdVar5[0x21] = pdVar5[0x21] - dVar39;
        pdVar5[0x24] = pdVar5[0x24] + dVar39;
        pdVar5[0x25] = pdVar5[0x25] - dVar39;
        dVar36 = local_4f8[0] * -dVar36;
        pdVar5[0x3c] = pdVar5[0x3c] + dVar36;
        pdVar5[0x3f] = pdVar5[0x3f] - dVar36;
        pdVar5[0x42] = pdVar5[0x42] + dVar36;
        pdVar5[0x43] = pdVar5[0x43] - dVar36;
        dVar36 = (double)local_488._0_8_ * local_4f8[3];
        pdVar5[0x46] = pdVar5[0x46] + dVar36;
        pdVar5[0x49] = pdVar5[0x49] - dVar36;
        pdVar5[0x4c] = pdVar5[0x4c] + dVar36;
        pdVar5[0x4d] = pdVar5[0x4d] - dVar36;
        pdVar5[0x5a] = pdVar5[0x5a] + dVar37;
        pdVar5[0x5d] = pdVar5[0x5d] - dVar37;
        pdVar5[0x60] = pdVar5[0x60] + dVar37;
        pdVar5[0x61] = pdVar5[0x61] - dVar37;
        local_418 = local_4f8[4];
        local_578._0_8_ = local_4f8[7] * local_4f8[4];
        dVar36 = exp((double)local_3d8._0_8_ + (double)local_498._0_8_);
        local_488._8_4_ = extraout_XMM0_Dc_12;
        local_488._0_8_ = dVar36 * 9.55;
        local_488._12_4_ = extraout_XMM0_Dd_12;
        uVar31 = local_2f8._12_4_;
        local_2f8._8_4_ = local_2f8._8_4_;
        local_2f8._0_8_ = local_2f8._0_8_ + dVar33;
        local_2f8._12_4_ = uVar31;
        local_398 = local_4f8[5];
        local_478 = local_4f8[6];
        dStack_470 = 0.0;
        local_3e8._0_8_ = local_4f8[5] * local_4f8[6];
        dVar36 = exp(((local_3b8 - (double)local_548._0_8_) - (double)local_388._0_8_) +
                     (double)local_3c8._0_8_);
        dVar36 = (double)local_488._0_8_ / dVar36;
        dVar39 = (double)local_488._0_8_ * (double)local_578._0_8_ -
                 (double)local_3e8._0_8_ * dVar36;
        dVar37 = (double)local_2f8._0_8_ * (double)local_488._0_8_ * (double)local_578._0_8_ -
                 ((double)local_2f8._0_8_ -
                 (((double)local_448._8_8_ + local_438) - ((double)local_448._0_8_ + local_430)) *
                 dVar38) * dVar36 * (double)local_3e8._0_8_;
        local_5a8 = local_5a8 - dVar39;
        auStack_5a0._0_8_ = dVar39 + (double)auStack_5a0._0_8_;
        auStack_5a0._8_8_ = dVar39 + (double)auStack_5a0._8_8_;
        dStack_590 = dStack_590 - dVar39;
        dVar39 = (double)local_488._0_8_ * dVar34;
        pdVar5[0x2c] = pdVar5[0x2c] - dVar39;
        pdVar5[0x2d] = dVar39 + pdVar5[0x2d];
        pdVar5[0x2e] = dVar39 + pdVar5[0x2e];
        pdVar5[0x2f] = pdVar5[0x2f] - dVar39;
        dVar39 = local_478 * -dVar36;
        pdVar5[0x36] = pdVar5[0x36] - dVar39;
        pdVar5[0x37] = dVar39 + pdVar5[0x37];
        pdVar5[0x38] = dVar39 + pdVar5[0x38];
        pdVar5[0x39] = pdVar5[0x39] - dVar39;
        dVar36 = -dVar36 * local_398;
        pdVar5[0x40] = pdVar5[0x40] - dVar36;
        pdVar5[0x41] = dVar36 + pdVar5[0x41];
        pdVar5[0x42] = dVar36 + pdVar5[0x42];
        pdVar5[0x43] = pdVar5[0x43] - dVar36;
        dVar36 = (double)local_488._0_8_ * local_418;
        pdVar5[0x4a] = pdVar5[0x4a] - dVar36;
        auVar17._8_4_ = SUB84(dVar36 + pdVar5[0x4c],0);
        auVar17._0_8_ = dVar36 + pdVar5[0x4b];
        auVar17._12_4_ = (int)((ulong)(dVar36 + pdVar5[0x4c]) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x4b) = auVar17;
        pdVar5[0x4d] = pdVar5[0x4d] - dVar36;
        pdVar5[0x5e] = pdVar5[0x5e] - dVar37;
        auVar18._8_4_ = SUB84(dVar37 + pdVar5[0x60],0);
        auVar18._0_8_ = dVar37 + pdVar5[0x5f];
        auVar18._12_4_ = (int)((ulong)(dVar37 + pdVar5[0x60]) >> 0x20);
        *(undefined1 (*) [16])(pdVar5 + 0x5f) = auVar18;
        pdVar5[0x61] = pdVar5[0x61] - dVar37;
        dVar34 = dVar34 * local_398;
        local_398 = exp(local_2d8);
        local_398 = local_398 * 1000000.0;
        local_418 = local_4f8[2];
        local_3b8 = local_4f8[6];
        local_2d8 = local_4f8[2] * local_4f8[6];
        uVar31 = local_548._12_4_;
        dVar36 = ((local_548._0_8_ - local_2b8) - (double)local_388._0_8_) + (double)local_3c8._0_8_
        ;
        local_548._8_4_ = local_548._8_4_;
        local_548._0_8_ = dVar36;
        local_548._12_4_ = uVar31;
        dVar36 = exp(dVar36);
        dVar33 = local_4f8[7];
        dVar36 = local_398 / dVar36;
        dVar39 = local_398 * dVar34 - local_2d8 * dVar36;
        local_5b8._0_8_ = (double)local_5b8._0_8_ + dVar39;
        auStack_5a0._0_8_ = (double)auStack_5a0._0_8_ - dVar39;
        dStack_590 = dStack_590 - dVar39;
        auStack_5a0._8_8_ = dVar39 + (double)auStack_5a0._8_8_;
        dVar39 = local_3b8 * -dVar36;
        pdVar5[0x16] = pdVar5[0x16] + dVar39;
        pdVar5[0x19] = pdVar5[0x19] - dVar39;
        dVar34 = (double)local_2c8._0_8_ * local_398 * dVar34 -
                 ((double)local_2c8._0_8_ -
                 ((local_458 + local_438) - ((double)local_448._8_8_ + local_430)) * dVar38) *
                 dVar36 * local_2d8;
        pdVar5[0x1a] = dVar39 + pdVar5[0x1a];
        pdVar5[0x1b] = pdVar5[0x1b] - dVar39;
        dVar39 = local_398 * local_4f8[7];
        pdVar5[0x34] = pdVar5[0x34] + dVar39;
        pdVar5[0x37] = pdVar5[0x37] - dVar39;
        pdVar5[0x38] = pdVar5[0x38] + dVar39;
        pdVar5[0x39] = pdVar5[0x39] - dVar39;
        local_418 = -dVar36 * local_418;
        pdVar5[0x3e] = pdVar5[0x3e] + local_418;
        pdVar5[0x41] = pdVar5[0x41] - local_418;
        pdVar5[0x42] = pdVar5[0x42] + local_418;
        pdVar5[0x43] = pdVar5[0x43] - local_418;
        local_418 = local_4f8[5];
        dVar36 = local_398 * local_4f8[5];
        pdVar5[0x48] = pdVar5[0x48] + dVar36;
        pdVar5[0x4b] = pdVar5[0x4b] - dVar36;
        pdVar5[0x4c] = pdVar5[0x4c] + dVar36;
        pdVar5[0x4d] = pdVar5[0x4d] - dVar36;
        pdVar5[0x5c] = pdVar5[0x5c] + dVar34;
        pdVar5[0x5f] = pdVar5[0x5f] - dVar34;
        pdVar5[0x60] = pdVar5[0x60] + dVar34;
        pdVar5[0x61] = pdVar5[0x61] - dVar34;
        local_2c8._0_8_ = exp(dVar38 * -4809.241675095709 + (double)local_378._0_8_);
        local_3b8 = local_4f8[2];
        local_388._0_8_ = local_4f8[6];
        dVar36 = exp((double)local_548._0_8_);
        dVar37 = (double)local_2c8._0_8_ * 580000000.0;
        dVar39 = local_408 * 4809.241675095709 + (double)local_368._0_8_;
        dVar36 = dVar37 / dVar36;
        dVar34 = dVar37 * dVar33 * local_418 - local_3b8 * (double)local_388._0_8_ * dVar36;
        dVar39 = dVar39 * dVar37 * dVar33 * local_418 -
                 (dVar39 - ((local_458 + local_438) - ((double)local_448._8_8_ + local_430)) *
                           dVar38) * dVar36 * local_3b8 * (double)local_388._0_8_;
        local_5b8._0_8_ = (double)local_5b8._0_8_ + dVar34;
        auStack_5a0._8_8_ = dVar34 + (double)auStack_5a0._8_8_;
        auStack_5a0._0_8_ = (double)auStack_5a0._0_8_ - dVar34;
        dStack_590 = dStack_590 - dVar34;
        dVar34 = (double)local_388._0_8_ * -dVar36;
        pdVar5[0x16] = pdVar5[0x16] + dVar34;
        pdVar5[0x19] = pdVar5[0x19] - dVar34;
        pdVar5[0x1a] = dVar34 + pdVar5[0x1a];
        pdVar5[0x1b] = pdVar5[0x1b] - dVar34;
        dVar34 = local_4f8[7] * dVar37;
        pdVar5[0x34] = pdVar5[0x34] + dVar34;
        pdVar5[0x37] = pdVar5[0x37] - dVar34;
        pdVar5[0x38] = pdVar5[0x38] + dVar34;
        pdVar5[0x39] = pdVar5[0x39] - dVar34;
        dVar36 = -dVar36 * local_3b8;
        pdVar5[0x3e] = pdVar5[0x3e] + dVar36;
        pdVar5[0x41] = pdVar5[0x41] - dVar36;
        pdVar5[0x42] = pdVar5[0x42] + dVar36;
        pdVar5[0x43] = pdVar5[0x43] - dVar36;
        dVar37 = dVar37 * local_4f8[5];
        pdVar5[0x48] = pdVar5[0x48] + dVar37;
        pdVar5[0x4b] = pdVar5[0x4b] - dVar37;
        pdVar5[0x4c] = pdVar5[0x4c] + dVar37;
        pdVar5[0x4d] = pdVar5[0x4d] - dVar37;
        pdVar5[0x5c] = pdVar5[0x5c] + dVar39;
        pdVar5[0x5f] = pdVar5[0x5f] - dVar39;
        pdVar5[0x60] = pdVar5[0x60] + dVar39;
        pdVar5[0x61] = pdVar5[0x61] - dVar39;
        if (iVar20 == 2) {
          local_270 = local_198 * 0.0 + local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 2.5;
          if (1000.0 <= local_2e8) {
            dVar36 = local_198 * -1.13643531e-15 +
                     local_188 * 1.77528148e-11 +
                     local_128 * -1.25884199e-07 + local_2e8 * 0.000613519689 + 3.69757819;
            local_288._8_4_ = SUB84(dVar36,0);
            local_288._0_8_ =
                 local_198 * 1.58275179e-15 +
                 local_188 * -9.23157818e-12 +
                 local_128 * -5.63382869e-08 + local_2e8 * 0.000700064411 + 2.99142337;
            local_288._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_278 = local_198 * -6.39161787e-15 +
                        local_188 * 1.20099639e-10 +
                        local_128 * -8.73026011e-07 + local_2e8 * 0.00305629289 + 2.67214561;
            local_268._8_8_ =
                 local_198 * -1.33195876e-15 +
                 local_188 * 3.05218674e-11 +
                 local_128 * -2.59082758e-07 + local_2e8 * 0.00105650448 + 2.86472886;
            local_268._0_8_ =
                 local_198 * -4.3680515e-16 +
                 local_188 * 4.55106742e-12 +
                 local_128 * -3.10280335e-09 + local_2e8 * -2.75506191e-05 + 2.54205966;
            local_258._8_8_ =
                 local_198 * -1.43165356e-14 +
                 local_188 * 2.34890357e-10 +
                 local_128 * -1.47468882e-06 + local_2e8 * 0.00433613639 + 4.57316685;
            local_258._0_8_ =
                 local_198 * -1.07908535e-14 +
                 local_188 * 1.1424637e-10 +
                 local_128 * -6.3365815e-07 + local_2e8 * 0.00223982013 + 4.0172109;
            local_248 = local_198 * -6.753351e-15 +
                        local_188 * 1.009704e-10 +
                        local_128 * -5.684761e-07 + local_2e8 * 0.001487977 + 2.92664;
            local_238[0] = local_188 * 6.33100716e-15 +
                           local_128 * -2.76947345e-11 +
                           local_2e8 * -1.12676574e-07 + 0.000700064411;
            local_238[1] = local_188 * -4.54574124e-15 +
                           local_128 * 5.32584444e-11 + local_2e8 * -2.51768398e-07 + 0.000613519689
            ;
            local_238[2] = local_188 * -2.55664715e-14 +
                           local_128 * 3.60298917e-10 + local_2e8 * -1.74605202e-06 + 0.00305629289;
            local_238[3] = local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 0.0;
            local_238[4] = local_188 * -1.7472206e-15 +
                           local_128 * 1.36532023e-11 + local_2e8 * -6.2056067e-09 + -2.75506191e-05
            ;
            local_238[5] = local_188 * -5.32783504e-15 +
                           local_128 * 9.15656022e-11 + local_2e8 * -5.18165516e-07 + 0.00105650448;
            local_238[6] = local_188 * -4.3163414e-14 +
                           local_128 * 3.4273911e-10 + local_2e8 * -1.2673163e-06 + 0.00223982013;
            local_238[7] = local_188 * -5.72661424e-14 +
                           local_128 * 7.04671071e-10 + local_2e8 * -2.94937764e-06 + 0.00433613639;
            dVar39 = local_128 * 3.029112e-10 + local_2e8 * -1.1369522e-06 + 0.001487977;
            dVar36 = local_188 * -2.7013404e-14;
          }
          else {
            dVar36 = local_198 * -8.76855392e-13 +
                     local_188 * 1.31387723e-09 +
                     local_128 * -5.75615047e-07 + local_2e8 * 0.00112748635 + 3.2129364;
            local_288._8_4_ = SUB84(dVar36,0);
            local_288._0_8_ =
                 local_198 * 4.13487224e-13 +
                 local_188 * -9.47543433e-11 +
                 local_128 * -8.14301529e-07 + local_2e8 * 0.000824944174 + 3.29812431;
            local_288._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_278 = local_198 * -2.50658847e-12 +
                        local_188 * 6.96858127e-09 +
                        local_128 * -6.35469633e-06 + local_2e8 * 0.00347498246 + 3.38684249;
            local_268._8_8_ =
                 local_198 * 2.06237379e-12 +
                 local_188 * -5.79853643e-09 +
                 local_128 * 6.52764691e-06 + local_2e8 * -0.00322544939 + 4.12530561;
            local_268._0_8_ =
                 local_198 * 3.89069636e-13 +
                 local_188 * -1.60284319e-09 +
                 local_128 * 2.4210317e-06 + local_2e8 * -0.00163816649 + 2.94642878;
            local_258._8_8_ =
                 local_198 * 2.47151475e-12 +
                 local_188 * -4.62580552e-09 +
                 local_128 * -1.48501258e-07 + local_2e8 * 0.00656922581 + 3.38875365;
            local_258._0_8_ =
                 local_198 * 9.29225124e-12 +
                 local_188 * -2.42763894e-08 +
                 local_128 * 2.11582891e-05 + local_2e8 * -0.00474912051 + 4.30179801;
            local_248 = local_198 * -2.444855e-12 +
                        local_188 * 5.641515e-09 +
                        local_128 * -3.963222e-06 + local_2e8 * 0.00140824 + 3.298677;
            local_238[0] = local_188 * 1.6539489e-12 +
                           local_128 * -2.8426303e-10 + local_2e8 * -1.62860306e-06 + 0.000824944174
            ;
            local_238[1] = local_188 * -3.50742157e-12 +
                           local_128 * 3.94163169e-09 + local_2e8 * -1.15123009e-06 + 0.00112748635;
            local_238[2] = local_188 * -1.00263539e-11 +
                           local_128 * 2.09057438e-08 + local_2e8 * -1.27093927e-05 + 0.00347498246;
            local_238[3] = local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 0.0;
            local_238[4] = local_188 * 1.55627854e-12 +
                           local_128 * -4.80852957e-09 + local_2e8 * 4.8420634e-06 + -0.00163816649;
            local_238[5] = local_188 * 8.24949516e-12 +
                           local_128 * -1.73956093e-08 + local_2e8 * 1.30552938e-05 + -0.00322544939
            ;
            local_238[6] = local_188 * 3.7169005e-11 +
                           local_128 * -7.28291682e-08 + local_2e8 * 4.23165782e-05 + -0.00474912051
            ;
            local_238[7] = local_188 * 9.886059e-12 +
                           local_128 * -1.38774166e-08 + local_2e8 * -2.97002516e-07 + 0.00656922581
            ;
            dVar39 = local_128 * 1.6924545e-08 + local_2e8 * -7.926444e-06 + 0.00140824;
            dVar36 = local_188 * -9.77942e-12;
          }
          local_238[8] = dVar36 + dVar39;
          pdVar23 = &local_468;
        }
        else {
          local_270 = local_198 * 0.0 + local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 1.5;
          if (1000.0 <= local_2e8) {
            dVar36 = local_198 * -1.13643531e-15 +
                     local_188 * 1.77528148e-11 +
                     local_128 * -1.25884199e-07 + local_2e8 * 0.000613519689 + 2.69757819;
            local_288._8_4_ = SUB84(dVar36,0);
            local_288._0_8_ =
                 local_198 * 1.58275179e-15 +
                 local_188 * -9.23157818e-12 +
                 local_128 * -5.63382869e-08 + local_2e8 * 0.000700064411 + 1.99142337;
            local_288._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_278 = local_198 * -6.39161787e-15 +
                        local_188 * 1.20099639e-10 +
                        local_128 * -8.73026011e-07 + local_2e8 * 0.00305629289 + 1.67214561;
            dVar36 = local_198 * -1.33195876e-15 +
                     local_188 * 3.05218674e-11 +
                     local_128 * -2.59082758e-07 + local_2e8 * 0.00105650448 + 1.86472886;
            local_268._8_4_ = SUB84(dVar36,0);
            local_268._0_8_ =
                 local_198 * -4.3680515e-16 +
                 local_188 * 4.55106742e-12 +
                 local_128 * -3.10280335e-09 + local_2e8 * -2.75506191e-05 + 1.54205966;
            local_268._12_4_ = (int)((ulong)dVar36 >> 0x20);
            dVar36 = local_198 * -1.43165356e-14 +
                     local_188 * 2.34890357e-10 +
                     local_128 * -1.47468882e-06 + local_2e8 * 0.00433613639 + 3.57316685;
            local_258._8_4_ = SUB84(dVar36,0);
            local_258._0_8_ =
                 local_198 * -1.07908535e-14 +
                 local_188 * 1.1424637e-10 +
                 local_128 * -6.3365815e-07 + local_2e8 * 0.00223982013 + 3.0172109;
            local_258._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_248 = local_198 * -6.753351e-15 +
                        local_188 * 1.009704e-10 +
                        local_128 * -5.684761e-07 + local_2e8 * 0.001487977 + 1.92664;
            local_238[0] = local_188 * 6.33100716e-15 +
                           local_128 * -2.76947345e-11 +
                           local_2e8 * -1.12676574e-07 + 0.000700064411;
            local_238[1] = local_188 * -4.54574124e-15 +
                           local_128 * 5.32584444e-11 + local_2e8 * -2.51768398e-07 + 0.000613519689
            ;
            local_238[2] = local_188 * -2.55664715e-14 +
                           local_128 * 3.60298917e-10 + local_2e8 * -1.74605202e-06 + 0.00305629289;
            local_238[3] = local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 0.0;
            local_238[4] = local_188 * -1.7472206e-15 +
                           local_128 * 1.36532023e-11 + local_2e8 * -6.2056067e-09 + -2.75506191e-05
            ;
            local_238[5] = local_188 * -5.32783504e-15 +
                           local_128 * 9.15656022e-11 + local_2e8 * -5.18165516e-07 + 0.00105650448;
            local_238[6] = local_188 * -4.3163414e-14 +
                           local_128 * 3.4273911e-10 + local_2e8 * -1.2673163e-06 + 0.00223982013;
            local_238[7] = local_188 * -5.72661424e-14 +
                           local_128 * 7.04671071e-10 + local_2e8 * -2.94937764e-06 + 0.00433613639;
            local_238[8] = local_188 * -2.7013404e-14 +
                           local_128 * 3.029112e-10 + local_2e8 * -1.1369522e-06 + 0.001487977;
            local_178 = dVar38 * -835.033997 +
                        local_198 * 3.16550358e-16 +
                        local_188 * -2.30789455e-12 +
                        local_128 * -1.8779429e-08 + local_2e8 * 0.000350032206 + 1.99142337;
            dStack_170 = dVar38 * -1233.93018 +
                         local_198 * -2.27287062e-16 +
                         local_188 * 4.4382037e-12 +
                         local_128 * -4.19613997e-08 + local_2e8 * 0.000306759845 + 2.69757819;
            dVar36 = dVar38 * 25471.627 + local_270;
            local_168._8_4_ = SUB84(dVar36,0);
            local_168._0_8_ =
                 dVar38 * -29899.209 +
                 local_198 * -1.27832357e-15 +
                 local_188 * 3.00249098e-11 +
                 local_128 * -2.9100867e-07 + local_2e8 * 0.00152814644 + 1.67214561;
            local_168._12_4_ = (int)((ulong)dVar36 >> 0x20);
            dVar36 = dVar38 * 3683.62875 +
                     local_198 * -2.66391752e-16 +
                     local_188 * 7.63046685e-12 +
                     local_128 * -8.63609193e-08 + local_2e8 * 0.00052825224 + 1.86472886;
            local_158._8_4_ = SUB84(dVar36,0);
            local_158._0_8_ =
                 dVar38 * 29230.8027 +
                 local_198 * -8.736103e-17 +
                 local_188 * 1.13776685e-12 +
                 local_128 * -1.03426778e-09 + local_2e8 * -1.37753096e-05 + 1.54205966;
            local_158._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_148 = dVar38 * 111.856713 +
                        local_198 * -2.1581707e-15 +
                        local_188 * 2.85615925e-11 +
                        local_128 * -2.11219383e-07 + local_2e8 * 0.00111991006 + 3.0172109;
            dStack_140 = dVar38 * -18006.9609 +
                         local_198 * -2.86330712e-15 +
                         local_188 * 5.87225893e-11 +
                         local_128 * -4.9156294e-07 + local_2e8 * 0.0021680682 + 3.57316685;
            dVar39 = local_198 * -1.3506702e-15 +
                     local_188 * 2.52426e-11 +
                     local_128 * -1.89492033e-07 + local_2e8 * 0.0007439885 + 1.92664;
            dVar36 = dVar38 * -922.7977;
          }
          else {
            dVar36 = local_198 * -8.76855392e-13 +
                     local_188 * 1.31387723e-09 +
                     local_128 * -5.75615047e-07 + local_2e8 * 0.00112748635 + 2.2129364;
            local_288._8_4_ = SUB84(dVar36,0);
            local_288._0_8_ =
                 local_198 * 4.13487224e-13 +
                 local_188 * -9.47543433e-11 +
                 local_128 * -8.14301529e-07 + local_2e8 * 0.000824944174 + 2.29812431;
            local_288._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_278 = local_198 * -2.50658847e-12 +
                        local_188 * 6.96858127e-09 +
                        local_128 * -6.35469633e-06 + local_2e8 * 0.00347498246 + 2.38684249;
            dVar36 = local_198 * 2.06237379e-12 +
                     local_188 * -5.79853643e-09 +
                     local_128 * 6.52764691e-06 + local_2e8 * -0.00322544939 + 3.12530561;
            local_268._8_4_ = SUB84(dVar36,0);
            local_268._0_8_ =
                 local_198 * 3.89069636e-13 +
                 local_188 * -1.60284319e-09 +
                 local_128 * 2.4210317e-06 + local_2e8 * -0.00163816649 + 1.94642878;
            local_268._12_4_ = (int)((ulong)dVar36 >> 0x20);
            dVar36 = local_198 * 2.47151475e-12 +
                     local_188 * -4.62580552e-09 +
                     local_128 * -1.48501258e-07 + local_2e8 * 0.00656922581 + 2.38875365;
            local_258._8_4_ = SUB84(dVar36,0);
            local_258._0_8_ =
                 local_198 * 9.29225124e-12 +
                 local_188 * -2.42763894e-08 +
                 local_128 * 2.11582891e-05 + local_2e8 * -0.00474912051 + 3.30179801;
            local_258._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_248 = local_198 * -2.444855e-12 +
                        local_188 * 5.641515e-09 +
                        local_128 * -3.963222e-06 + local_2e8 * 0.00140824 + 2.298677;
            local_238[0] = local_188 * 1.6539489e-12 +
                           local_128 * -2.8426303e-10 + local_2e8 * -1.62860306e-06 + 0.000824944174
            ;
            local_238[1] = local_188 * -3.50742157e-12 +
                           local_128 * 3.94163169e-09 + local_2e8 * -1.15123009e-06 + 0.00112748635;
            local_238[2] = local_188 * -1.00263539e-11 +
                           local_128 * 2.09057438e-08 + local_2e8 * -1.27093927e-05 + 0.00347498246;
            local_238[3] = local_188 * 0.0 + local_128 * 0.0 + local_2e8 * 0.0 + 0.0;
            local_238[4] = local_188 * 1.55627854e-12 +
                           local_128 * -4.80852957e-09 + local_2e8 * 4.8420634e-06 + -0.00163816649;
            local_238[5] = local_188 * 8.24949516e-12 +
                           local_128 * -1.73956093e-08 + local_2e8 * 1.30552938e-05 + -0.00322544939
            ;
            local_238[6] = local_188 * 3.7169005e-11 +
                           local_128 * -7.28291682e-08 + local_2e8 * 4.23165782e-05 + -0.00474912051
            ;
            local_238[7] = local_188 * 9.886059e-12 +
                           local_128 * -1.38774166e-08 + local_2e8 * -2.97002516e-07 + 0.00656922581
            ;
            local_238[8] = local_188 * -9.77942e-12 +
                           local_128 * 1.6924545e-08 + local_2e8 * -7.926444e-06 + 0.00140824;
            local_178 = dVar38 * -1012.52087 +
                        local_198 * 8.26974448e-14 +
                        local_188 * -2.36885858e-11 +
                        local_128 * -2.71433843e-07 + local_2e8 * 0.000412472087 + 2.29812431;
            dStack_170 = dVar38 * -1005.24902 +
                         local_198 * -1.75371078e-13 +
                         local_188 * 3.28469308e-10 +
                         local_128 * -1.91871682e-07 + local_2e8 * 0.000563743175 + 2.2129364;
            dVar36 = dVar38 * 25471.627 + local_270;
            local_168._8_4_ = SUB84(dVar36,0);
            local_168._0_8_ =
                 dVar38 * -30208.1133 +
                 local_198 * -5.01317694e-13 +
                 local_188 * 1.74214532e-09 +
                 local_128 * -2.11823211e-06 + local_2e8 * 0.00173749123 + 2.38684249;
            local_168._12_4_ = (int)((ulong)dVar36 >> 0x20);
            dVar36 = dVar38 * 3346.30913 +
                     local_198 * 4.12474758e-13 +
                     local_188 * -1.44963411e-09 +
                     local_128 * 2.1758823e-06 + local_2e8 * -0.0016127247 + 3.12530561;
            local_158._8_4_ = SUB84(dVar36,0);
            local_158._0_8_ =
                 dVar38 * 29147.6445 +
                 local_198 * 7.78139272e-14 +
                 local_188 * -4.00710797e-10 +
                 local_128 * 8.07010567e-07 + local_2e8 * -0.000819083245 + 1.94642878;
            local_158._12_4_ = (int)((ulong)dVar36 >> 0x20);
            local_148 = dVar38 * 294.80804 +
                        local_198 * 1.85845025e-12 +
                        local_188 * -6.06909735e-09 +
                        local_128 * 7.05276303e-06 + local_2e8 * -0.00237456025 + 3.30179801;
            dStack_140 = dVar38 * -17663.1465 +
                         local_198 * 4.9430295e-13 +
                         local_188 * -1.15645138e-09 +
                         local_128 * -4.95004193e-08 + local_2e8 * 0.0032846129 + 2.38875365;
            dVar39 = local_198 * -4.88971e-13 +
                     local_188 * 1.41037875e-09 +
                     local_128 * -1.321074e-06 + local_2e8 * 0.00070412 + 2.298677;
            dVar36 = dVar38 * -1020.9;
          }
          local_138 = dVar36 + dVar39;
          pdVar23 = &local_178;
        }
        dVar39 = 0.0;
        dVar34 = 0.0;
        dVar36 = 0.0;
        lVar25 = 0;
        dVar37 = 0.0;
        do {
          dVar37 = dVar37 + *(double *)(local_288 + lVar25) * *(double *)((long)local_4f8 + lVar25);
          dVar33 = *(double *)((long)pdVar23 + lVar25);
          dVar39 = dVar39 + *(double *)((long)local_4f8 + lVar25) *
                            *(double *)((long)local_238 + lVar25);
          dVar34 = dVar34 + *(double *)(local_5c8 + lVar25) * dVar33;
          dVar36 = dVar36 + (*(double *)(local_288 + lVar25) - dVar33) * dVar38 *
                            *(double *)(local_5c8 + lVar25) +
                            dVar33 * *(double *)((long)pdVar5 + lVar25 + 0x2d0);
          lVar25 = lVar25 + 8;
        } while (lVar25 != 0x48);
        dVar34 = dVar34 * (1.0 / dVar37);
        dVar38 = (1.0 / dVar37) * local_2e8;
        dVar37 = dVar34 * dVar38;
        dVar38 = -dVar38;
        pdVar22 = pdVar5 + 9;
        lVar25 = 0;
        pdVar27 = pdVar5;
        do {
          dVar33 = 0.0;
          lVar29 = 0;
          do {
            dVar33 = dVar33 + pdVar23[lVar29] * pdVar27[lVar29];
            lVar29 = lVar29 + 1;
          } while (lVar29 != 9);
          pdVar22[lVar25 * 10] = *(double *)(local_288 + lVar25 * 8) * dVar37 + dVar33 * dVar38;
          lVar25 = lVar25 + 1;
          pdVar27 = pdVar27 + 10;
        } while (lVar25 != 9);
        pdVar5[99] = dVar38 * dVar36 + (dVar37 * dVar39 - dVar34);
        lVar25 = 0;
        do {
          pdVar5[lVar25 + 0x5a] = pdVar5[lVar25 + 0x5a] * 1e-06;
          *pdVar22 = *pdVar22 * 1000000.0;
          lVar25 = lVar25 + 1;
          pdVar22 = pdVar22 + 10;
        } while (lVar25 != 9);
        pdVar5 = *(double **)(lVar4 + uVar30 * 8);
        lVar25 = 0;
        pdVar23 = pdVar5;
        do {
          dVar36 = local_118[lVar25];
          lVar29 = 0;
          pdVar22 = pdVar23;
          do {
            *pdVar22 = (dVar36 / local_118[lVar29]) * *pdVar22;
            lVar29 = lVar29 + 1;
            pdVar22 = pdVar22 + 10;
          } while (lVar29 != 9);
          pdVar5[lVar25 * 10 + 9] = pdVar5[lVar25 * 10 + 9] / dVar36;
          lVar25 = lVar25 + 1;
          pdVar23 = pdVar23 + 1;
        } while (lVar25 != 9);
        lVar25 = 0;
        do {
          pdVar5[lVar25 + 0x5a] = local_118[lVar25] * pdVar5[lVar25 + 0x5a];
          lVar25 = lVar25 + 1;
        } while (lVar25 != 9);
        uVar31 = SUB84(local_2e8,0);
        uVar32 = (undefined4)((ulong)local_2e8 >> 0x20);
        prVar21 = local_1b8;
        jcurPtr = local_1b0;
      }
      uVar30 = uVar30 + 1;
      local_290 = local_290 + 10;
    } while (uVar30 != uVar2);
    iVar19 = 1;
  }
  *jcurPtr = iVar19;
  piVar6 = (int *)*local_1c0;
  lVar25 = 1;
  iVar20 = *piVar6;
  do {
    iVar19 = piVar6[lVar25];
    if (iVar19 - iVar20 != 0 && iVar20 <= iVar19) {
      lVar29 = *local_1a8;
      uVar30 = 0;
      do {
        if (0 < (int)uVar2) {
          uVar3 = *(uint *)((long)iVar20 * 4 + lVar29 + uVar30 * 4);
          uVar24 = 0;
          do {
            lVar26 = *(long *)(lVar4 + uVar24 * 8);
            if (lVar25 - 1U == (ulong)uVar3) {
              dVar36 = *(double *)(lVar26 + (long)(int)uVar3 * 0x58) * -(double)local_1e8._0_8_ +
                       1.0;
            }
            else {
              dVar36 = *(double *)(lVar26 + (lVar25 - 1U) * 8 + (long)(int)uVar3 * 0x50) *
                       -(double)local_1e8._0_8_;
            }
            *(double *)
             (*(long *)(local_1a0 + uVar24 * 8) + uVar30 * 8 +
             (long)*(int *)(local_1c0[uVar24] + -4 + lVar25 * 4) * 8) = dVar36;
            uVar24 = uVar24 + 1;
          } while (uVar2 != uVar24);
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != (uint)(iVar19 - iVar20));
    }
    lVar25 = lVar25 + 1;
    iVar20 = iVar19;
  } while (lVar25 != 0xb);
  return 0;
}

Assistant:

int
Precond_custom(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  booleantype jok,
  booleantype* jcurPtr,
  amrex::Real gamma,
  void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::Precond_custom()");
  // Make local copies of pointers to input data
  amrex::Real* u_d = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto ncells = udata->ncells;
  auto reactor_type = udata->reactor_type;
  auto* JSPSmat = udata->JSPSmat;
  auto* rowPtrs = udata->rowPtrs;
  auto* colVals = udata->colVals;
  auto* Jdata = udata->Jdata;

  // MW CGS
  amrex::Real mw[NUM_SPECIES] = {0.0};
  get_mw(mw);

  // Check if Jac is stale
  if (jok != 0) {
    // jok = SUNTRUE: Copy Jbd to P
    *jcurPtr = SUNFALSE;
  } else {
    // Save Jac from cell to cell if more than one
    amrex::Real temp_save_lcl = 0.0;
    for (int tid = 0; tid < ncells; tid++) {
      // Offset in case several cells
      int offset = tid * (NUM_SPECIES + 1);
      // rho MKS
      amrex::Real rho = 0.0;
      for (int i = 0; i < NUM_SPECIES; i++) {
        rho = rho + u_d[offset + i];
      }
      // Yks
      amrex::Real massfrac[NUM_SPECIES] = {0.0};
      amrex::Real rhoinv = 1.0 / rho;
      for (int i = 0; i < NUM_SPECIES; i++) {
        massfrac[i] = u_d[offset + i] * rhoinv;
      }
      amrex::Real temp = u_d[offset + NUM_SPECIES];
      // Activities
      amrex::Real activity[NUM_SPECIES] = {0.0};
      auto eos = pele::physics::PhysicsType::eos();
      eos.RTY2C(rho, temp, massfrac, activity);

      // Do we recompute Jac ?
      if (fabs(temp - temp_save_lcl) > 1.0) {
        // Formalism
        int consP =
          static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
        DWDOT_SIMPLIFIED(JSPSmat[tid], activity, &temp, &consP);

        for (int i = 0; i < NUM_SPECIES; i++) {
          for (int k = 0; k < NUM_SPECIES; k++) {
            (JSPSmat[tid])[k * (NUM_SPECIES + 1) + i] *= mw[i] / mw[k];
          }
          (JSPSmat[tid])[i * (NUM_SPECIES + 1) + NUM_SPECIES] /= mw[i];
        }
        for (int i = 0; i < NUM_SPECIES; i++) {
          (JSPSmat[tid])[NUM_SPECIES * (NUM_SPECIES + 1) + i] *= mw[i];
        }
        temp_save_lcl = temp;
      } else {
        // if not: copy the one from prev cell
        for (int i = 0; i < NUM_SPECIES + 1; i++) {
          for (int k = 0; k < NUM_SPECIES + 1; k++) {
            (JSPSmat[tid])[k * (NUM_SPECIES + 1) + i] =
              (JSPSmat[tid - 1])[k * (NUM_SPECIES + 1) + i];
          }
        }
      }
    }
    *jcurPtr = SUNTRUE;
  }

  for (int i = 1; i < NUM_SPECIES + 2; i++) {
    // nb non zeros elem should be the same for all cells
    int nbVals = rowPtrs[0][i] - rowPtrs[0][i - 1];
    for (int j = 0; j < nbVals; j++) {
      // row of non zero elem should be the same for all cells
      int idx = colVals[0][rowPtrs[0][i - 1] + j];
      // Scale by -gamma
      // Add identity matrix
      for (int tid = 0; tid < ncells; tid++) {
        if (idx == (i - 1)) {
          Jdata[tid][rowPtrs[tid][i - 1] + j] =
            1.0 - gamma * (JSPSmat[tid])[idx * (NUM_SPECIES + 1) + idx];
        } else {
          Jdata[tid][rowPtrs[tid][i - 1] + j] =
            -gamma * (JSPSmat[tid])[(i - 1) + (NUM_SPECIES + 1) * idx];
        }
      }
    }
  }

  return (0);
}